

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

bool embree::avx2::CurveNvIntersectorK<4,8>::
     occluded_t<embree::avx2::RibbonCurve1IntersectorK<embree::BSplineCurveT,8,8>,embree::avx2::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  Primitive *pPVar1;
  undefined1 (*pauVar2) [32];
  undefined1 (*pauVar3) [32];
  float *pfVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  undefined1 auVar7 [32];
  Primitive PVar8;
  Geometry *pGVar9;
  code *pcVar10;
  RTCFilterFunctionN p_Var11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  long lVar21;
  long lVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  long lVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  undefined8 uVar87;
  undefined8 uVar88;
  undefined1 auVar89 [32];
  undefined1 auVar90 [28];
  undefined1 auVar91 [28];
  undefined1 auVar92 [24];
  byte bVar93;
  int iVar94;
  uint uVar95;
  ulong uVar96;
  ulong uVar97;
  uint uVar98;
  ulong uVar99;
  ulong uVar100;
  long lVar101;
  undefined4 uVar102;
  undefined8 uVar103;
  float fVar121;
  vint4 bi_2;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar110 [16];
  float fVar123;
  float fVar124;
  float fVar125;
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  float fVar120;
  float fVar122;
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar119 [32];
  float fVar126;
  undefined8 uVar127;
  vint4 bi_1;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [32];
  float fVar140;
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [64];
  float fVar141;
  float fVar142;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  float fVar157;
  float fVar162;
  vint4 ai_2;
  undefined1 auVar158 [16];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  vint4 ai;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  vint4 bi;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [64];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [64];
  vint4 ai_1;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [32];
  undefined1 auVar196 [32];
  undefined1 auVar193 [32];
  undefined1 auVar195 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [64];
  undefined1 auVar201 [16];
  undefined1 auVar202 [32];
  undefined4 uVar203;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [64];
  float fVar209;
  undefined1 auVar210 [16];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [64];
  undefined1 auVar214 [64];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  RTCFilterFunctionNArguments args;
  undefined1 local_920 [32];
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  undefined8 local_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  RTCFilterFunctionNArguments local_730;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_5f0 [8];
  float fStack_5e8;
  float fStack_5e4;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined4 local_5c0;
  undefined4 uStack_5bc;
  undefined4 uStack_5b8;
  undefined4 uStack_5b4;
  undefined4 uStack_5b0;
  undefined4 uStack_5ac;
  undefined4 uStack_5a8;
  undefined4 uStack_5a4;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined4 local_540;
  undefined4 uStack_53c;
  undefined4 uStack_538;
  undefined4 uStack_534;
  undefined4 uStack_530;
  undefined4 uStack_52c;
  undefined4 uStack_528;
  undefined4 uStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  int local_340;
  int local_33c;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  float local_2c0 [4];
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [32];
  undefined4 local_260;
  undefined4 uStack_25c;
  undefined4 uStack_258;
  undefined4 uStack_254;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  undefined4 uStack_248;
  undefined4 uStack_244;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined1 local_1a0 [32];
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  float local_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  uint local_120;
  uint uStack_11c;
  uint uStack_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint uStack_108;
  uint uStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar152 [32];
  undefined1 auVar194 [16];
  
  PVar8 = prim[1];
  uVar96 = (ulong)(byte)PVar8;
  lVar75 = uVar96 * 0x19;
  fVar142 = *(float *)(prim + lVar75 + 0x12);
  auVar169 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar169 = vinsertps_avx(auVar169,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar12 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar12 = vinsertps_avx(auVar12,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar169 = vsubps_avx(auVar169,*(undefined1 (*) [16])(prim + lVar75 + 6));
  auVar104._0_4_ = fVar142 * auVar169._0_4_;
  auVar104._4_4_ = fVar142 * auVar169._4_4_;
  auVar104._8_4_ = fVar142 * auVar169._8_4_;
  auVar104._12_4_ = fVar142 * auVar169._12_4_;
  auVar174._0_4_ = fVar142 * auVar12._0_4_;
  auVar174._4_4_ = fVar142 * auVar12._4_4_;
  auVar174._8_4_ = fVar142 * auVar12._8_4_;
  auVar174._12_4_ = fVar142 * auVar12._12_4_;
  auVar169 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar96 * 4 + 6)));
  auVar169 = vcvtdq2ps_avx(auVar169);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar96 * 5 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar96 * 6 + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar96 * 0xb + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar166 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar8 * 0xc) + 6)));
  auVar166 = vcvtdq2ps_avx(auVar166);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar8 * 0xc + uVar96 + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  uVar99 = (ulong)(uint)((int)(uVar96 * 9) * 2);
  auVar107 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 + 6)));
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar106 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 + uVar96 + 6)));
  auVar106 = vcvtdq2ps_avx(auVar106);
  uVar99 = (ulong)(uint)((int)(uVar96 * 5) << 2);
  auVar143 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 + 6)));
  auVar143 = vcvtdq2ps_avx(auVar143);
  auVar215._4_4_ = auVar174._0_4_;
  auVar215._0_4_ = auVar174._0_4_;
  auVar215._8_4_ = auVar174._0_4_;
  auVar215._12_4_ = auVar174._0_4_;
  auVar129 = vshufps_avx(auVar174,auVar174,0x55);
  auVar105 = vshufps_avx(auVar174,auVar174,0xaa);
  fVar142 = auVar105._0_4_;
  auVar204._0_4_ = fVar142 * auVar14._0_4_;
  fVar141 = auVar105._4_4_;
  auVar204._4_4_ = fVar141 * auVar14._4_4_;
  fVar120 = auVar105._8_4_;
  auVar204._8_4_ = fVar120 * auVar14._8_4_;
  fVar121 = auVar105._12_4_;
  auVar204._12_4_ = fVar121 * auVar14._12_4_;
  auVar201._0_4_ = auVar16._0_4_ * fVar142;
  auVar201._4_4_ = auVar16._4_4_ * fVar141;
  auVar201._8_4_ = auVar16._8_4_ * fVar120;
  auVar201._12_4_ = auVar16._12_4_ * fVar121;
  auVar190._0_4_ = auVar143._0_4_ * fVar142;
  auVar190._4_4_ = auVar143._4_4_ * fVar141;
  auVar190._8_4_ = auVar143._8_4_ * fVar120;
  auVar190._12_4_ = auVar143._12_4_ * fVar121;
  auVar105 = vfmadd231ps_fma(auVar204,auVar129,auVar12);
  auVar130 = vfmadd231ps_fma(auVar201,auVar129,auVar166);
  auVar129 = vfmadd231ps_fma(auVar190,auVar106,auVar129);
  auVar158 = vfmadd231ps_fma(auVar105,auVar215,auVar169);
  auVar208 = ZEXT1664(auVar158);
  auVar130 = vfmadd231ps_fma(auVar130,auVar215,auVar15);
  auVar164 = vfmadd231ps_fma(auVar129,auVar107,auVar215);
  auVar216._4_4_ = auVar104._0_4_;
  auVar216._0_4_ = auVar104._0_4_;
  auVar216._8_4_ = auVar104._0_4_;
  auVar216._12_4_ = auVar104._0_4_;
  auVar129 = vshufps_avx(auVar104,auVar104,0x55);
  auVar105 = vshufps_avx(auVar104,auVar104,0xaa);
  fVar142 = auVar105._0_4_;
  auVar175._0_4_ = fVar142 * auVar14._0_4_;
  fVar141 = auVar105._4_4_;
  auVar175._4_4_ = fVar141 * auVar14._4_4_;
  fVar120 = auVar105._8_4_;
  auVar175._8_4_ = fVar120 * auVar14._8_4_;
  fVar121 = auVar105._12_4_;
  auVar175._12_4_ = fVar121 * auVar14._12_4_;
  auVar128._0_4_ = auVar16._0_4_ * fVar142;
  auVar128._4_4_ = auVar16._4_4_ * fVar141;
  auVar128._8_4_ = auVar16._8_4_ * fVar120;
  auVar128._12_4_ = auVar16._12_4_ * fVar121;
  auVar105._0_4_ = auVar143._0_4_ * fVar142;
  auVar105._4_4_ = auVar143._4_4_ * fVar141;
  auVar105._8_4_ = auVar143._8_4_ * fVar120;
  auVar105._12_4_ = auVar143._12_4_ * fVar121;
  auVar12 = vfmadd231ps_fma(auVar175,auVar129,auVar12);
  auVar14 = vfmadd231ps_fma(auVar128,auVar129,auVar166);
  auVar166 = vfmadd231ps_fma(auVar105,auVar129,auVar106);
  auVar16 = vfmadd231ps_fma(auVar12,auVar216,auVar169);
  auVar106 = vfmadd231ps_fma(auVar14,auVar216,auVar15);
  auVar143 = vfmadd231ps_fma(auVar166,auVar216,auVar107);
  local_3d0._8_4_ = 0x7fffffff;
  local_3d0._0_8_ = 0x7fffffff7fffffff;
  local_3d0._12_4_ = 0x7fffffff;
  auVar169 = vandps_avx(auVar158,local_3d0);
  auVar163._8_4_ = 0x219392ef;
  auVar163._0_8_ = 0x219392ef219392ef;
  auVar163._12_4_ = 0x219392ef;
  auVar169 = vcmpps_avx(auVar169,auVar163,1);
  auVar12 = vblendvps_avx(auVar158,auVar163,auVar169);
  auVar169 = vandps_avx(auVar130,local_3d0);
  auVar169 = vcmpps_avx(auVar169,auVar163,1);
  auVar14 = vblendvps_avx(auVar130,auVar163,auVar169);
  auVar169 = vandps_avx(auVar164,local_3d0);
  auVar169 = vcmpps_avx(auVar169,auVar163,1);
  auVar169 = vblendvps_avx(auVar164,auVar163,auVar169);
  auVar15 = vrcpps_avx(auVar12);
  auVar186._8_4_ = 0x3f800000;
  auVar186._0_8_ = 0x3f8000003f800000;
  auVar186._12_4_ = 0x3f800000;
  auVar12 = vfnmadd213ps_fma(auVar12,auVar15,auVar186);
  auVar15 = vfmadd132ps_fma(auVar12,auVar15,auVar15);
  auVar12 = vrcpps_avx(auVar14);
  auVar14 = vfnmadd213ps_fma(auVar14,auVar12,auVar186);
  auVar166 = vfmadd132ps_fma(auVar14,auVar12,auVar12);
  auVar12 = vrcpps_avx(auVar169);
  auVar169 = vfnmadd213ps_fma(auVar169,auVar12,auVar186);
  auVar107 = vfmadd132ps_fma(auVar169,auVar12,auVar12);
  auVar169._8_8_ = 0;
  auVar169._0_8_ = *(ulong *)(prim + uVar96 * 7 + 6);
  auVar169 = vpmovsxwd_avx(auVar169);
  auVar169 = vcvtdq2ps_avx(auVar169);
  auVar169 = vsubps_avx(auVar169,auVar16);
  auVar164._0_4_ = auVar15._0_4_ * auVar169._0_4_;
  auVar164._4_4_ = auVar15._4_4_ * auVar169._4_4_;
  auVar164._8_4_ = auVar15._8_4_ * auVar169._8_4_;
  auVar164._12_4_ = auVar15._12_4_ * auVar169._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar96 * 9 + 6);
  auVar169 = vpmovsxwd_avx(auVar12);
  auVar169 = vcvtdq2ps_avx(auVar169);
  auVar169 = vsubps_avx(auVar169,auVar16);
  auVar176._0_4_ = auVar15._0_4_ * auVar169._0_4_;
  auVar176._4_4_ = auVar15._4_4_ * auVar169._4_4_;
  auVar176._8_4_ = auVar15._8_4_ * auVar169._8_4_;
  auVar176._12_4_ = auVar15._12_4_ * auVar169._12_4_;
  auVar130._1_3_ = 0;
  auVar130[0] = PVar8;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + 6);
  auVar12 = vpmovsxwd_avx(auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + uVar96 * -2 + 6);
  auVar169 = vpmovsxwd_avx(auVar15);
  auVar169 = vcvtdq2ps_avx(auVar169);
  auVar169 = vsubps_avx(auVar169,auVar106);
  auVar191._0_4_ = auVar169._0_4_ * auVar166._0_4_;
  auVar191._4_4_ = auVar169._4_4_ * auVar166._4_4_;
  auVar191._8_4_ = auVar169._8_4_ * auVar166._8_4_;
  auVar191._12_4_ = auVar169._12_4_ * auVar166._12_4_;
  auVar169 = vcvtdq2ps_avx(auVar12);
  auVar169 = vsubps_avx(auVar169,auVar106);
  auVar129._0_4_ = auVar166._0_4_ * auVar169._0_4_;
  auVar129._4_4_ = auVar166._4_4_ * auVar169._4_4_;
  auVar129._8_4_ = auVar166._8_4_ * auVar169._8_4_;
  auVar129._12_4_ = auVar166._12_4_ * auVar169._12_4_;
  auVar166._8_8_ = 0;
  auVar166._0_8_ = *(ulong *)(prim + uVar99 + uVar96 + 6);
  auVar169 = vpmovsxwd_avx(auVar166);
  auVar169 = vcvtdq2ps_avx(auVar169);
  auVar169 = vsubps_avx(auVar169,auVar143);
  auVar158._0_4_ = auVar107._0_4_ * auVar169._0_4_;
  auVar158._4_4_ = auVar107._4_4_ * auVar169._4_4_;
  auVar158._8_4_ = auVar107._8_4_ * auVar169._8_4_;
  auVar158._12_4_ = auVar107._12_4_ * auVar169._12_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar96 * 0x17 + 6);
  auVar169 = vpmovsxwd_avx(auVar16);
  auVar169 = vcvtdq2ps_avx(auVar169);
  auVar169 = vsubps_avx(auVar169,auVar143);
  auVar106._0_4_ = auVar107._0_4_ * auVar169._0_4_;
  auVar106._4_4_ = auVar107._4_4_ * auVar169._4_4_;
  auVar106._8_4_ = auVar107._8_4_ * auVar169._8_4_;
  auVar106._12_4_ = auVar107._12_4_ * auVar169._12_4_;
  auVar169 = vpminsd_avx(auVar164,auVar176);
  auVar12 = vpminsd_avx(auVar191,auVar129);
  auVar169 = vmaxps_avx(auVar169,auVar12);
  auVar12 = vpminsd_avx(auVar158,auVar106);
  uVar102 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar194._4_4_ = uVar102;
  auVar194._0_4_ = uVar102;
  auVar194._8_4_ = uVar102;
  auVar194._12_4_ = uVar102;
  auVar200 = ZEXT1664(auVar194);
  auVar12 = vmaxps_avx(auVar12,auVar194);
  auVar169 = vmaxps_avx(auVar169,auVar12);
  local_3e0._0_4_ = auVar169._0_4_ * 0.99999964;
  local_3e0._4_4_ = auVar169._4_4_ * 0.99999964;
  local_3e0._8_4_ = auVar169._8_4_ * 0.99999964;
  local_3e0._12_4_ = auVar169._12_4_ * 0.99999964;
  auVar169 = vpmaxsd_avx(auVar164,auVar176);
  auVar12 = vpmaxsd_avx(auVar191,auVar129);
  auVar169 = vminps_avx(auVar169,auVar12);
  auVar12 = vpmaxsd_avx(auVar158,auVar106);
  uVar102 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar143._4_4_ = uVar102;
  auVar143._0_4_ = uVar102;
  auVar143._8_4_ = uVar102;
  auVar143._12_4_ = uVar102;
  auVar12 = vminps_avx(auVar12,auVar143);
  auVar169 = vminps_avx(auVar169,auVar12);
  auVar107._0_4_ = auVar169._0_4_ * 1.0000004;
  auVar107._4_4_ = auVar169._4_4_ * 1.0000004;
  auVar107._8_4_ = auVar169._8_4_ * 1.0000004;
  auVar107._12_4_ = auVar169._12_4_ * 1.0000004;
  auVar130[4] = PVar8;
  auVar130._5_3_ = 0;
  auVar130[8] = PVar8;
  auVar130._9_3_ = 0;
  auVar130[0xc] = PVar8;
  auVar130._13_3_ = 0;
  auVar12 = vpcmpgtd_avx(auVar130,_DAT_01f7fcf0);
  auVar169 = vcmpps_avx(local_3e0,auVar107,2);
  auVar169 = vandps_avx(auVar169,auVar12);
  uVar98 = vmovmskps_avx(auVar169);
  if (uVar98 == 0) {
    bVar93 = 0;
  }
  else {
    uVar98 = uVar98 & 0xff;
    local_5e0 = mm_lookupmask_ps._16_8_;
    uStack_5d8 = mm_lookupmask_ps._24_8_;
    uStack_5d0 = mm_lookupmask_ps._16_8_;
    uStack_5c8 = mm_lookupmask_ps._24_8_;
    iVar94 = 1 << ((uint)k & 0x1f);
    auVar111._4_4_ = iVar94;
    auVar111._0_4_ = iVar94;
    auVar111._8_4_ = iVar94;
    auVar111._12_4_ = iVar94;
    auVar111._16_4_ = iVar94;
    auVar111._20_4_ = iVar94;
    auVar111._24_4_ = iVar94;
    auVar111._28_4_ = iVar94;
    auVar137 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
    auVar111 = vpand_avx2(auVar111,auVar137);
    local_3c0 = vpcmpeqd_avx2(auVar111,auVar137);
    do {
      auVar111 = local_520;
      local_6e0 = auVar200._0_32_;
      auVar137 = auVar208._0_32_;
      lVar21 = 0;
      uVar99 = (ulong)uVar98;
      for (uVar96 = uVar99; (uVar96 & 1) == 0; uVar96 = uVar96 >> 1 | 0x8000000000000000) {
        lVar21 = lVar21 + 1;
      }
      uVar99 = uVar99 - 1 & uVar99;
      local_540 = *(undefined4 *)(prim + lVar21 * 4 + 6);
      uVar96 = (ulong)(uint)((int)lVar21 << 6);
      uVar98 = *(uint *)(prim + 2);
      pGVar9 = (context->scene->geometries).items[uVar98].ptr;
      pPVar1 = prim + uVar96 + lVar75 + 0x16;
      uVar87 = *(undefined8 *)pPVar1;
      uVar88 = *(undefined8 *)(pPVar1 + 8);
      auVar12 = *(undefined1 (*) [16])pPVar1;
      auVar169 = *(undefined1 (*) [16])pPVar1;
      if (uVar99 != 0) {
        uVar100 = uVar99 - 1 & uVar99;
        for (uVar97 = uVar99; (uVar97 & 1) == 0; uVar97 = uVar97 >> 1 | 0x8000000000000000) {
        }
        if (uVar100 != 0) {
          for (; (uVar100 & 1) == 0; uVar100 = uVar100 >> 1 | 0x8000000000000000) {
          }
        }
      }
      auVar14 = *(undefined1 (*) [16])(prim + uVar96 + lVar75 + 0x26);
      auVar15 = *(undefined1 (*) [16])(prim + uVar96 + lVar75 + 0x36);
      _local_5f0 = *(undefined1 (*) [16])(prim + uVar96 + lVar75 + 0x46);
      iVar94 = (int)pGVar9[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar166 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c);
      auVar106 = vinsertps_avx(auVar166,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar16 = vsubps_avx(*(undefined1 (*) [16])pPVar1,auVar106);
      uVar102 = auVar16._0_4_;
      auVar165._4_4_ = uVar102;
      auVar165._0_4_ = uVar102;
      auVar165._8_4_ = uVar102;
      auVar165._12_4_ = uVar102;
      auVar166 = vshufps_avx(auVar16,auVar16,0x55);
      auVar16 = vshufps_avx(auVar16,auVar16,0xaa);
      aVar5 = pre->ray_space[k].vx.field_0;
      aVar6 = pre->ray_space[k].vy.field_0;
      fVar142 = pre->ray_space[k].vz.field_0.m128[0];
      fVar141 = pre->ray_space[k].vz.field_0.m128[1];
      fVar120 = pre->ray_space[k].vz.field_0.m128[2];
      fVar121 = pre->ray_space[k].vz.field_0.m128[3];
      auVar181._0_4_ = fVar142 * auVar16._0_4_;
      auVar181._4_4_ = fVar141 * auVar16._4_4_;
      auVar181._8_4_ = fVar120 * auVar16._8_4_;
      auVar181._12_4_ = fVar121 * auVar16._12_4_;
      auVar166 = vfmadd231ps_fma(auVar181,(undefined1  [16])aVar6,auVar166);
      auVar129 = vfmadd231ps_fma(auVar166,(undefined1  [16])aVar5,auVar165);
      auVar166 = vblendps_avx(auVar129,*(undefined1 (*) [16])pPVar1,8);
      auVar107 = vsubps_avx(auVar14,auVar106);
      uVar102 = auVar107._0_4_;
      auVar182._4_4_ = uVar102;
      auVar182._0_4_ = uVar102;
      auVar182._8_4_ = uVar102;
      auVar182._12_4_ = uVar102;
      auVar16 = vshufps_avx(auVar107,auVar107,0x55);
      auVar107 = vshufps_avx(auVar107,auVar107,0xaa);
      auVar195._0_4_ = fVar142 * auVar107._0_4_;
      auVar195._4_4_ = fVar141 * auVar107._4_4_;
      auVar195._8_4_ = fVar120 * auVar107._8_4_;
      auVar195._12_4_ = fVar121 * auVar107._12_4_;
      auVar16 = vfmadd231ps_fma(auVar195,(undefined1  [16])aVar6,auVar16);
      auVar105 = vfmadd231ps_fma(auVar16,(undefined1  [16])aVar5,auVar182);
      auVar16 = vblendps_avx(auVar105,auVar14,8);
      auVar143 = vsubps_avx(auVar15,auVar106);
      uVar102 = auVar143._0_4_;
      auVar187._4_4_ = uVar102;
      auVar187._0_4_ = uVar102;
      auVar187._8_4_ = uVar102;
      auVar187._12_4_ = uVar102;
      auVar107 = vshufps_avx(auVar143,auVar143,0x55);
      auVar143 = vshufps_avx(auVar143,auVar143,0xaa);
      auVar205._0_4_ = fVar142 * auVar143._0_4_;
      auVar205._4_4_ = fVar141 * auVar143._4_4_;
      auVar205._8_4_ = fVar120 * auVar143._8_4_;
      auVar205._12_4_ = fVar121 * auVar143._12_4_;
      auVar107 = vfmadd231ps_fma(auVar205,(undefined1  [16])aVar6,auVar107);
      auVar130 = vfmadd231ps_fma(auVar107,(undefined1  [16])aVar5,auVar187);
      auVar107 = vblendps_avx(auVar130,auVar15,8);
      auVar143 = vsubps_avx(_local_5f0,auVar106);
      uVar102 = auVar143._0_4_;
      auVar188._4_4_ = uVar102;
      auVar188._0_4_ = uVar102;
      auVar188._8_4_ = uVar102;
      auVar188._12_4_ = uVar102;
      auVar106 = vshufps_avx(auVar143,auVar143,0x55);
      auVar143 = vshufps_avx(auVar143,auVar143,0xaa);
      auVar210._0_4_ = fVar142 * auVar143._0_4_;
      auVar210._4_4_ = fVar141 * auVar143._4_4_;
      auVar210._8_4_ = fVar120 * auVar143._8_4_;
      auVar210._12_4_ = fVar121 * auVar143._12_4_;
      auVar106 = vfmadd231ps_fma(auVar210,(undefined1  [16])aVar6,auVar106);
      auVar158 = vfmadd231ps_fma(auVar106,(undefined1  [16])aVar5,auVar188);
      auVar106 = vblendps_avx(auVar158,_local_5f0,8);
      auVar166 = vandps_avx(auVar166,local_3d0);
      auVar16 = vandps_avx(auVar16,local_3d0);
      auVar143 = vmaxps_avx(auVar166,auVar16);
      auVar166 = vandps_avx(auVar107,local_3d0);
      auVar16 = vandps_avx(auVar106,local_3d0);
      auVar166 = vmaxps_avx(auVar166,auVar16);
      auVar166 = vmaxps_avx(auVar143,auVar166);
      auVar16 = vmovshdup_avx(auVar166);
      auVar16 = vmaxss_avx(auVar16,auVar166);
      auVar166 = vshufpd_avx(auVar166,auVar166,1);
      auVar166 = vmaxss_avx(auVar166,auVar16);
      lVar21 = (long)iVar94 * 0x44;
      auVar16 = vmovshdup_avx(auVar129);
      uVar103 = auVar16._0_8_;
      local_5a0._8_8_ = uVar103;
      local_5a0._0_8_ = uVar103;
      local_5a0._16_8_ = uVar103;
      local_5a0._24_8_ = uVar103;
      auVar16 = vmovshdup_avx(auVar105);
      uVar103 = auVar16._0_8_;
      auVar220._8_8_ = uVar103;
      auVar220._0_8_ = uVar103;
      auVar220._16_8_ = uVar103;
      auVar220._24_8_ = uVar103;
      auVar118 = *(undefined1 (*) [32])(bspline_basis0 + lVar21 + 0x908);
      uVar203 = auVar130._0_4_;
      auVar149._4_4_ = uVar203;
      auVar149._0_4_ = uVar203;
      auVar149._8_4_ = uVar203;
      auVar149._12_4_ = uVar203;
      auVar149._16_4_ = uVar203;
      auVar149._20_4_ = uVar203;
      auVar149._24_4_ = uVar203;
      auVar149._28_4_ = uVar203;
      auVar16 = vmovshdup_avx(auVar130);
      uVar103 = auVar16._0_8_;
      auVar206._8_8_ = uVar103;
      auVar206._0_8_ = uVar103;
      auVar206._16_8_ = uVar103;
      auVar206._24_8_ = uVar103;
      fVar142 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar21 + 0xd8c);
      auVar90 = *(undefined1 (*) [28])(bspline_basis0 + lVar21 + 0xd8c);
      fVar209 = auVar158._0_4_;
      auVar16 = vmovshdup_avx(auVar158);
      uVar103 = auVar16._0_8_;
      auVar180._4_4_ = fVar209 * *(float *)(bspline_basis0 + lVar21 + 0xd90);
      auVar180._0_4_ = fVar209 * fVar142;
      auVar180._8_4_ = fVar209 * *(float *)(bspline_basis0 + lVar21 + 0xd94);
      auVar180._12_4_ = fVar209 * *(float *)(bspline_basis0 + lVar21 + 0xd98);
      auVar180._16_4_ = fVar209 * *(float *)(bspline_basis0 + lVar21 + 0xd9c);
      auVar180._20_4_ = fVar209 * *(float *)(bspline_basis0 + lVar21 + 0xda0);
      auVar180._24_4_ = fVar209 * *(float *)(bspline_basis0 + lVar21 + 0xda4);
      auVar180._28_4_ = *(undefined4 *)(bspline_basis0 + lVar21 + 0xda8);
      auVar107 = vfmadd231ps_fma(auVar180,auVar118,auVar149);
      fVar157 = auVar16._0_4_;
      auVar154._0_4_ = fVar157 * fVar142;
      fVar162 = auVar16._4_4_;
      auVar154._4_4_ = fVar162 * *(float *)(bspline_basis0 + lVar21 + 0xd90);
      auVar154._8_4_ = fVar157 * *(float *)(bspline_basis0 + lVar21 + 0xd94);
      auVar154._12_4_ = fVar162 * *(float *)(bspline_basis0 + lVar21 + 0xd98);
      auVar154._16_4_ = fVar157 * *(float *)(bspline_basis0 + lVar21 + 0xd9c);
      auVar154._20_4_ = fVar162 * *(float *)(bspline_basis0 + lVar21 + 0xda0);
      auVar154._24_4_ = fVar157 * *(float *)(bspline_basis0 + lVar21 + 0xda4);
      auVar154._28_4_ = 0;
      auVar16 = vfmadd231ps_fma(auVar154,auVar118,auVar206);
      auVar180 = *(undefined1 (*) [32])(bspline_basis0 + lVar21 + 0x484);
      uVar102 = auVar105._0_4_;
      auVar202._4_4_ = uVar102;
      auVar202._0_4_ = uVar102;
      auVar202._8_4_ = uVar102;
      auVar202._12_4_ = uVar102;
      auVar202._16_4_ = uVar102;
      auVar202._20_4_ = uVar102;
      auVar202._24_4_ = uVar102;
      auVar202._28_4_ = uVar102;
      auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar180,auVar202);
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar180,auVar220);
      auVar154 = *(undefined1 (*) [32])(bspline_basis0 + lVar21);
      local_580._0_4_ = auVar129._0_4_;
      auVar217._4_4_ = local_580._0_4_;
      auVar217._0_4_ = local_580._0_4_;
      auVar217._8_4_ = local_580._0_4_;
      auVar217._12_4_ = local_580._0_4_;
      auVar217._16_4_ = local_580._0_4_;
      auVar217._20_4_ = local_580._0_4_;
      auVar217._24_4_ = local_580._0_4_;
      auVar217._28_4_ = local_580._0_4_;
      auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar154,auVar217);
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar154,local_5a0);
      local_4a0 = *(undefined1 (*) [32])(bspline_basis1 + lVar21 + 0x908);
      fVar125 = *(float *)(bspline_basis1 + lVar21 + 0xd8c);
      fVar76 = *(float *)(bspline_basis1 + lVar21 + 0xd90);
      fVar77 = *(float *)(bspline_basis1 + lVar21 + 0xd94);
      fVar78 = *(float *)(bspline_basis1 + lVar21 + 0xd98);
      fVar79 = *(float *)(bspline_basis1 + lVar21 + 0xd9c);
      fVar80 = *(float *)(bspline_basis1 + lVar21 + 0xda0);
      fVar81 = *(float *)(bspline_basis1 + lVar21 + 0xda4);
      auVar7._4_4_ = fVar76 * fVar209;
      auVar7._0_4_ = fVar125 * fVar209;
      auVar7._8_4_ = fVar77 * fVar209;
      auVar7._12_4_ = fVar78 * fVar209;
      auVar7._16_4_ = fVar79 * fVar209;
      auVar7._20_4_ = fVar80 * fVar209;
      auVar7._24_4_ = fVar81 * fVar209;
      auVar7._28_4_ = *(undefined4 *)(bspline_basis0 + lVar21 + 0xda8);
      auVar106 = vfmadd231ps_fma(auVar7,local_4a0,auVar149);
      auVar13._4_4_ = fVar76 * fVar162;
      auVar13._0_4_ = fVar125 * fVar157;
      auVar13._8_4_ = fVar77 * fVar157;
      auVar13._12_4_ = fVar78 * fVar162;
      auVar13._16_4_ = fVar79 * fVar157;
      auVar13._20_4_ = fVar80 * fVar162;
      auVar13._24_4_ = fVar81 * fVar157;
      auVar13._28_4_ = uVar203;
      auVar143 = vfmadd231ps_fma(auVar13,local_4a0,auVar206);
      auVar7 = *(undefined1 (*) [32])(bspline_basis1 + lVar21 + 0x484);
      auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar7,auVar202);
      auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),auVar7,auVar220);
      local_6c0 = *(undefined1 (*) [32])(bspline_basis1 + lVar21);
      auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),local_6c0,auVar217);
      auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),local_6c0,local_5a0);
      local_420 = ZEXT1632(auVar106);
      local_400 = ZEXT1632(auVar107);
      auVar192 = vsubps_avx(local_420,local_400);
      local_440 = ZEXT1632(auVar143);
      _local_460 = ZEXT1632(auVar16);
      _local_480 = vsubps_avx(local_440,_local_460);
      auVar112._0_4_ = auVar16._0_4_ * auVar192._0_4_;
      auVar112._4_4_ = auVar16._4_4_ * auVar192._4_4_;
      auVar112._8_4_ = auVar16._8_4_ * auVar192._8_4_;
      auVar112._12_4_ = auVar16._12_4_ * auVar192._12_4_;
      auVar112._16_4_ = auVar192._16_4_ * 0.0;
      auVar112._20_4_ = auVar192._20_4_ * 0.0;
      auVar112._24_4_ = auVar192._24_4_ * 0.0;
      auVar112._28_4_ = 0;
      fVar142 = local_480._0_4_;
      auVar131._0_4_ = auVar107._0_4_ * fVar142;
      fVar141 = local_480._4_4_;
      auVar131._4_4_ = auVar107._4_4_ * fVar141;
      fVar120 = local_480._8_4_;
      auVar131._8_4_ = auVar107._8_4_ * fVar120;
      fVar121 = local_480._12_4_;
      auVar131._12_4_ = auVar107._12_4_ * fVar121;
      fVar122 = local_480._16_4_;
      auVar131._16_4_ = fVar122 * 0.0;
      fVar123 = local_480._20_4_;
      auVar131._20_4_ = fVar123 * 0.0;
      fVar124 = local_480._24_4_;
      auVar131._24_4_ = fVar124 * 0.0;
      auVar131._28_4_ = 0;
      auVar112 = vsubps_avx(auVar112,auVar131);
      auVar16 = vpermilps_avx(*(undefined1 (*) [16])pPVar1,0xff);
      uVar127 = auVar16._0_8_;
      local_80._8_8_ = uVar127;
      local_80._0_8_ = uVar127;
      local_80._16_8_ = uVar127;
      local_80._24_8_ = uVar127;
      auVar107 = vpermilps_avx(auVar14,0xff);
      uVar127 = auVar107._0_8_;
      local_a0._8_8_ = uVar127;
      local_a0._0_8_ = uVar127;
      local_a0._16_8_ = uVar127;
      local_a0._24_8_ = uVar127;
      auVar107 = vpermilps_avx(auVar15,0xff);
      uVar127 = auVar107._0_8_;
      local_c0._8_8_ = uVar127;
      local_c0._0_8_ = uVar127;
      local_c0._16_8_ = uVar127;
      local_c0._24_8_ = uVar127;
      auVar107 = vpermilps_avx(_local_5f0,0xff);
      local_e0 = auVar107._0_8_;
      local_820._0_4_ = auVar90._0_4_;
      local_820._4_4_ = auVar90._4_4_;
      fStack_818 = auVar90._8_4_;
      fStack_814 = auVar90._12_4_;
      fStack_810 = auVar90._16_4_;
      fStack_80c = auVar90._20_4_;
      fStack_808 = auVar90._24_4_;
      fVar126 = auVar107._0_4_;
      fVar140 = auVar107._4_4_;
      auVar119._4_4_ = fVar140 * (float)local_820._4_4_;
      auVar119._0_4_ = fVar126 * (float)local_820._0_4_;
      auVar119._8_4_ = fVar126 * fStack_818;
      auVar119._12_4_ = fVar140 * fStack_814;
      auVar119._16_4_ = fVar126 * fStack_810;
      auVar119._20_4_ = fVar140 * fStack_80c;
      auVar119._24_4_ = fVar126 * fStack_808;
      auVar119._28_4_ = local_580._0_4_;
      auVar107 = vfmadd231ps_fma(auVar119,local_c0,auVar118);
      auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar180,local_a0);
      auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar154,local_80);
      uStack_d8 = local_e0;
      uStack_d0 = local_e0;
      uStack_c8 = local_e0;
      auVar20._4_4_ = fVar76 * fVar140;
      auVar20._0_4_ = fVar125 * fVar126;
      auVar20._8_4_ = fVar77 * fVar126;
      auVar20._12_4_ = fVar78 * fVar140;
      auVar20._16_4_ = fVar79 * fVar126;
      auVar20._20_4_ = fVar80 * fVar140;
      auVar20._24_4_ = fVar81 * fVar126;
      auVar20._28_4_ = auVar154._28_4_;
      auVar106 = vfmadd231ps_fma(auVar20,local_4a0,local_c0);
      auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar7,local_a0);
      auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),local_6c0,local_80);
      auVar196._4_4_ = fVar141 * fVar141;
      auVar196._0_4_ = fVar142 * fVar142;
      auVar196._8_4_ = fVar120 * fVar120;
      auVar196._12_4_ = fVar121 * fVar121;
      auVar196._16_4_ = fVar122 * fVar122;
      auVar196._20_4_ = fVar123 * fVar123;
      auVar196._24_4_ = fVar124 * fVar124;
      auVar196._28_4_ = auVar16._4_4_;
      auVar16 = vfmadd231ps_fma(auVar196,auVar192,auVar192);
      auVar13 = vmaxps_avx(ZEXT1632(auVar107),ZEXT1632(auVar106));
      auVar18._4_4_ = auVar13._4_4_ * auVar13._4_4_ * auVar16._4_4_;
      auVar18._0_4_ = auVar13._0_4_ * auVar13._0_4_ * auVar16._0_4_;
      auVar18._8_4_ = auVar13._8_4_ * auVar13._8_4_ * auVar16._8_4_;
      auVar18._12_4_ = auVar13._12_4_ * auVar13._12_4_ * auVar16._12_4_;
      auVar18._16_4_ = auVar13._16_4_ * auVar13._16_4_ * 0.0;
      auVar18._20_4_ = auVar13._20_4_ * auVar13._20_4_ * 0.0;
      auVar18._24_4_ = auVar13._24_4_ * auVar13._24_4_ * 0.0;
      auVar18._28_4_ = auVar13._28_4_;
      auVar19._4_4_ = auVar112._4_4_ * auVar112._4_4_;
      auVar19._0_4_ = auVar112._0_4_ * auVar112._0_4_;
      auVar19._8_4_ = auVar112._8_4_ * auVar112._8_4_;
      auVar19._12_4_ = auVar112._12_4_ * auVar112._12_4_;
      auVar19._16_4_ = auVar112._16_4_ * auVar112._16_4_;
      auVar19._20_4_ = auVar112._20_4_ * auVar112._20_4_;
      auVar19._24_4_ = auVar112._24_4_ * auVar112._24_4_;
      auVar19._28_4_ = auVar112._28_4_;
      auVar13 = vcmpps_avx(auVar19,auVar18,2);
      fVar142 = auVar166._0_4_ * 4.7683716e-07;
      auVar113._0_4_ = (float)iVar94;
      local_520._4_12_ = auVar158._4_12_;
      local_520._0_4_ = auVar113._0_4_;
      local_520._16_16_ = auVar111._16_16_;
      auVar113._4_4_ = auVar113._0_4_;
      auVar113._8_4_ = auVar113._0_4_;
      auVar113._12_4_ = auVar113._0_4_;
      auVar113._16_4_ = auVar113._0_4_;
      auVar113._20_4_ = auVar113._0_4_;
      auVar113._24_4_ = auVar113._0_4_;
      auVar113._28_4_ = auVar113._0_4_;
      auVar111 = vcmpps_avx(_DAT_01faff40,auVar113,1);
      auVar16 = vpermilps_avx(auVar129,0xaa);
      uVar127 = auVar16._0_8_;
      auVar159._8_8_ = uVar127;
      auVar159._0_8_ = uVar127;
      auVar159._16_8_ = uVar127;
      auVar159._24_8_ = uVar127;
      auVar166 = vpermilps_avx(auVar105,0xaa);
      uVar127 = auVar166._0_8_;
      local_100._8_8_ = uVar127;
      local_100._0_8_ = uVar127;
      local_100._16_8_ = uVar127;
      local_100._24_8_ = uVar127;
      auVar166 = vpermilps_avx(auVar130,0xaa);
      uVar127 = auVar166._0_8_;
      local_580._8_8_ = uVar127;
      local_580._0_8_ = uVar127;
      local_580._16_8_ = uVar127;
      local_580._24_8_ = uVar127;
      auVar166 = vshufps_avx(auVar158,auVar158,0xaa);
      uVar127 = auVar166._0_8_;
      register0x00001508 = uVar127;
      local_700 = uVar127;
      register0x00001510 = uVar127;
      register0x00001518 = uVar127;
      auVar112 = auVar111 & auVar13;
      uVar95 = *(uint *)(ray + k * 4 + 0x60);
      local_660._0_16_ = ZEXT416(uVar95);
      local_740 = auVar14._0_8_;
      uStack_738 = auVar14._8_8_;
      local_750 = auVar15._0_8_;
      uStack_748 = auVar15._8_8_;
      if ((((((((auVar112 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar112 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar112 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar112 >> 0x7f,0) == '\0') &&
            (auVar112 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar112 >> 0xbf,0) == '\0') &&
          (auVar112 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar112[0x1f]) {
        auVar208 = ZEXT3264(auVar137);
        auVar189 = ZEXT3264(CONCAT428(fVar209,CONCAT424(fVar209,CONCAT420(fVar209,CONCAT416(fVar209,
                                                  CONCAT412(fVar209,CONCAT48(fVar209,CONCAT44(
                                                  fVar209,fVar209))))))));
        auVar185 = ZEXT3264(CONCAT428(fVar162,CONCAT424(fVar157,CONCAT420(fVar162,CONCAT416(fVar157,
                                                  CONCAT412(fVar162,CONCAT48(fVar157,uVar103)))))));
LAB_015cb414:
        auVar214 = ZEXT3264(_local_700);
        uVar96 = 0;
      }
      else {
        local_5c0 = SUB84(pGVar9,0);
        uStack_5bc = (undefined4)((ulong)pGVar9 >> 0x20);
        _local_4c0 = vandps_avx(auVar13,auVar111);
        fVar126 = auVar166._0_4_;
        fVar140 = auVar166._4_4_;
        auVar17._4_4_ = fVar140 * fVar76;
        auVar17._0_4_ = fVar126 * fVar125;
        auVar17._8_4_ = fVar126 * fVar77;
        auVar17._12_4_ = fVar140 * fVar78;
        auVar17._16_4_ = fVar126 * fVar79;
        auVar17._20_4_ = fVar140 * fVar80;
        auVar17._24_4_ = fVar126 * fVar81;
        auVar17._28_4_ = local_4c0._28_4_;
        auVar166 = vfmadd213ps_fma(local_4a0,local_580,auVar17);
        auVar166 = vfmadd213ps_fma(auVar7,local_100,ZEXT1632(auVar166));
        auVar166 = vfmadd213ps_fma(local_6c0,auVar159,ZEXT1632(auVar166));
        local_6c0 = ZEXT1632(auVar166);
        auVar114._0_4_ = fVar126 * (float)local_820._0_4_;
        auVar114._4_4_ = fVar140 * (float)local_820._4_4_;
        auVar114._8_4_ = fVar126 * fStack_818;
        auVar114._12_4_ = fVar140 * fStack_814;
        auVar114._16_4_ = fVar126 * fStack_810;
        auVar114._20_4_ = fVar140 * fStack_80c;
        auVar114._24_4_ = fVar126 * fStack_808;
        auVar114._28_4_ = 0;
        auVar166 = vfmadd213ps_fma(auVar118,local_580,auVar114);
        auVar166 = vfmadd213ps_fma(auVar180,local_100,ZEXT1632(auVar166));
        auVar111 = *(undefined1 (*) [32])(bspline_basis0 + lVar21 + 0x1210);
        auVar118 = *(undefined1 (*) [32])(bspline_basis0 + lVar21 + 0x1694);
        auVar180 = *(undefined1 (*) [32])(bspline_basis0 + lVar21 + 0x1b18);
        fVar141 = *(float *)(bspline_basis0 + lVar21 + 0x1f9c);
        fVar120 = *(float *)(bspline_basis0 + lVar21 + 0x1fa0);
        fVar121 = *(float *)(bspline_basis0 + lVar21 + 0x1fa4);
        fVar122 = *(float *)(bspline_basis0 + lVar21 + 0x1fa8);
        fVar123 = *(float *)(bspline_basis0 + lVar21 + 0x1fac);
        fVar124 = *(float *)(bspline_basis0 + lVar21 + 0x1fb0);
        fVar125 = *(float *)(bspline_basis0 + lVar21 + 0x1fb4);
        auVar218._4_4_ = fVar209 * fVar120;
        auVar218._0_4_ = fVar209 * fVar141;
        auVar218._8_4_ = fVar209 * fVar121;
        auVar218._12_4_ = fVar209 * fVar122;
        auVar218._16_4_ = fVar209 * fVar123;
        auVar218._20_4_ = fVar209 * fVar124;
        auVar218._24_4_ = fVar209 * fVar125;
        auVar218._28_4_ = local_480._28_4_;
        auVar23._4_4_ = fVar162 * fVar120;
        auVar23._0_4_ = fVar157 * fVar141;
        auVar23._8_4_ = fVar157 * fVar121;
        auVar23._12_4_ = fVar162 * fVar122;
        auVar23._16_4_ = fVar157 * fVar123;
        auVar23._20_4_ = fVar162 * fVar124;
        auVar23._24_4_ = fVar157 * fVar125;
        auVar23._28_4_ = *(undefined4 *)(bspline_basis1 + lVar21 + 0xda8);
        auVar24._4_4_ = fVar140 * fVar120;
        auVar24._0_4_ = fVar126 * fVar141;
        auVar24._8_4_ = fVar126 * fVar121;
        auVar24._12_4_ = fVar140 * fVar122;
        auVar24._16_4_ = fVar126 * fVar123;
        auVar24._20_4_ = fVar140 * fVar124;
        auVar24._24_4_ = fVar126 * fVar125;
        auVar24._28_4_ = auVar192._28_4_;
        auVar143 = vfmadd231ps_fma(auVar218,auVar180,auVar149);
        auVar129 = vfmadd231ps_fma(auVar23,auVar180,auVar206);
        auVar105 = vfmadd231ps_fma(auVar24,local_580,auVar180);
        auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),auVar118,auVar202);
        auVar129 = vfmadd231ps_fma(ZEXT1632(auVar129),auVar118,auVar220);
        auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),local_100,auVar118);
        auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),auVar111,auVar217);
        auVar129 = vfmadd231ps_fma(ZEXT1632(auVar129),auVar111,local_5a0);
        auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar159,auVar111);
        fVar141 = *(float *)(bspline_basis1 + lVar21 + 0x1f9c);
        fVar120 = *(float *)(bspline_basis1 + lVar21 + 0x1fa0);
        fVar121 = *(float *)(bspline_basis1 + lVar21 + 0x1fa4);
        fVar122 = *(float *)(bspline_basis1 + lVar21 + 0x1fa8);
        fVar123 = *(float *)(bspline_basis1 + lVar21 + 0x1fac);
        fVar124 = *(float *)(bspline_basis1 + lVar21 + 0x1fb0);
        fVar125 = *(float *)(bspline_basis1 + lVar21 + 0x1fb4);
        auVar118._4_4_ = fVar209 * fVar120;
        auVar118._0_4_ = fVar209 * fVar141;
        auVar118._8_4_ = fVar209 * fVar121;
        auVar118._12_4_ = fVar209 * fVar122;
        auVar118._16_4_ = fVar209 * fVar123;
        auVar118._20_4_ = fVar209 * fVar124;
        auVar118._24_4_ = fVar209 * fVar125;
        auVar118._28_4_ = fVar209;
        auVar25._4_4_ = fVar162 * fVar120;
        auVar25._0_4_ = fVar157 * fVar141;
        auVar25._8_4_ = fVar157 * fVar121;
        auVar25._12_4_ = fVar162 * fVar122;
        auVar25._16_4_ = fVar157 * fVar123;
        auVar25._20_4_ = fVar162 * fVar124;
        auVar25._24_4_ = fVar157 * fVar125;
        auVar25._28_4_ = fVar162;
        auVar26._4_4_ = fVar120 * fVar140;
        auVar26._0_4_ = fVar141 * fVar126;
        auVar26._8_4_ = fVar121 * fVar126;
        auVar26._12_4_ = fVar122 * fVar140;
        auVar26._16_4_ = fVar123 * fVar126;
        auVar26._20_4_ = fVar124 * fVar140;
        auVar26._24_4_ = fVar125 * fVar126;
        auVar26._28_4_ = auVar16._4_4_;
        auVar111 = *(undefined1 (*) [32])(bspline_basis1 + lVar21 + 0x1b18);
        auVar16 = vfmadd231ps_fma(auVar118,auVar111,auVar149);
        auVar130 = vfmadd231ps_fma(auVar25,auVar111,auVar206);
        auVar158 = vfmadd231ps_fma(auVar26,auVar111,local_580);
        auVar111 = *(undefined1 (*) [32])(bspline_basis1 + lVar21 + 0x1694);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar111,auVar202);
        auVar130 = vfmadd231ps_fma(ZEXT1632(auVar130),auVar111,auVar220);
        auVar158 = vfmadd231ps_fma(ZEXT1632(auVar158),local_100,auVar111);
        auVar111 = *(undefined1 (*) [32])(bspline_basis1 + lVar21 + 0x1210);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar111,auVar217);
        auVar130 = vfmadd231ps_fma(ZEXT1632(auVar130),auVar111,local_5a0);
        auVar132._8_4_ = 0x7fffffff;
        auVar132._0_8_ = 0x7fffffff7fffffff;
        auVar132._12_4_ = 0x7fffffff;
        auVar132._16_4_ = 0x7fffffff;
        auVar132._20_4_ = 0x7fffffff;
        auVar132._24_4_ = 0x7fffffff;
        auVar132._28_4_ = 0x7fffffff;
        auVar158 = vfmadd231ps_fma(ZEXT1632(auVar158),auVar159,auVar111);
        auVar111 = vandps_avx(ZEXT1632(auVar143),auVar132);
        auVar118 = vandps_avx(ZEXT1632(auVar129),auVar132);
        auVar118 = vmaxps_avx(auVar111,auVar118);
        auVar111 = vandps_avx(ZEXT1632(auVar105),auVar132);
        auVar111 = vmaxps_avx(auVar118,auVar111);
        auVar150._4_4_ = fVar142;
        auVar150._0_4_ = fVar142;
        auVar150._8_4_ = fVar142;
        auVar150._12_4_ = fVar142;
        auVar150._16_4_ = fVar142;
        auVar150._20_4_ = fVar142;
        auVar150._24_4_ = fVar142;
        auVar150._28_4_ = fVar142;
        auVar111 = vcmpps_avx(auVar111,auVar150,1);
        auVar180 = vblendvps_avx(ZEXT1632(auVar143),auVar192,auVar111);
        auVar7 = vblendvps_avx(ZEXT1632(auVar129),_local_480,auVar111);
        auVar111 = vandps_avx(ZEXT1632(auVar16),auVar132);
        auVar118 = vandps_avx(ZEXT1632(auVar130),auVar132);
        auVar13 = vmaxps_avx(auVar111,auVar118);
        auVar111 = vandps_avx(ZEXT1632(auVar158),auVar132);
        auVar111 = vmaxps_avx(auVar13,auVar111);
        auVar112 = vcmpps_avx(auVar111,auVar150,1);
        auVar111 = vblendvps_avx(ZEXT1632(auVar16),auVar192,auVar112);
        auVar13 = vblendvps_avx(ZEXT1632(auVar130),_local_480,auVar112);
        auVar166 = vfmadd213ps_fma(auVar154,auVar159,ZEXT1632(auVar166));
        auVar16 = vfmadd213ps_fma(auVar180,auVar180,ZEXT832(0) << 0x20);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar7,auVar7);
        auVar154 = vrsqrtps_avx(ZEXT1632(auVar16));
        fVar141 = auVar154._0_4_;
        fVar120 = auVar154._4_4_;
        fVar121 = auVar154._8_4_;
        fVar122 = auVar154._12_4_;
        fVar123 = auVar154._16_4_;
        fVar124 = auVar154._20_4_;
        fVar125 = auVar154._24_4_;
        auVar192._4_4_ = fVar120 * fVar120 * fVar120 * auVar16._4_4_ * -0.5;
        auVar192._0_4_ = fVar141 * fVar141 * fVar141 * auVar16._0_4_ * -0.5;
        auVar192._8_4_ = fVar121 * fVar121 * fVar121 * auVar16._8_4_ * -0.5;
        auVar192._12_4_ = fVar122 * fVar122 * fVar122 * auVar16._12_4_ * -0.5;
        auVar192._16_4_ = fVar123 * fVar123 * fVar123 * -0.0;
        auVar192._20_4_ = fVar124 * fVar124 * fVar124 * -0.0;
        auVar192._24_4_ = fVar125 * fVar125 * fVar125 * -0.0;
        auVar192._28_4_ = 0;
        auVar172._8_4_ = 0x3fc00000;
        auVar172._0_8_ = 0x3fc000003fc00000;
        auVar172._12_4_ = 0x3fc00000;
        auVar172._16_4_ = 0x3fc00000;
        auVar172._20_4_ = 0x3fc00000;
        auVar172._24_4_ = 0x3fc00000;
        auVar172._28_4_ = 0x3fc00000;
        auVar16 = vfmadd231ps_fma(auVar192,auVar172,auVar154);
        fVar141 = auVar16._0_4_;
        fVar120 = auVar16._4_4_;
        auVar27._4_4_ = auVar7._4_4_ * fVar120;
        auVar27._0_4_ = auVar7._0_4_ * fVar141;
        fVar121 = auVar16._8_4_;
        auVar27._8_4_ = auVar7._8_4_ * fVar121;
        fVar122 = auVar16._12_4_;
        auVar27._12_4_ = auVar7._12_4_ * fVar122;
        auVar27._16_4_ = auVar7._16_4_ * 0.0;
        auVar27._20_4_ = auVar7._20_4_ * 0.0;
        auVar27._24_4_ = auVar7._24_4_ * 0.0;
        auVar27._28_4_ = auVar154._28_4_;
        auVar28._4_4_ = -auVar180._4_4_ * fVar120;
        auVar28._0_4_ = -auVar180._0_4_ * fVar141;
        auVar28._8_4_ = -auVar180._8_4_ * fVar121;
        auVar28._12_4_ = -auVar180._12_4_ * fVar122;
        auVar28._16_4_ = -auVar180._16_4_ * 0.0;
        auVar28._20_4_ = -auVar180._20_4_ * 0.0;
        auVar28._24_4_ = -auVar180._24_4_ * 0.0;
        auVar28._28_4_ = auVar118._28_4_;
        auVar16 = vfmadd213ps_fma(auVar111,auVar111,ZEXT832(0) << 0x20);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar13,auVar13);
        auVar118 = vrsqrtps_avx(ZEXT1632(auVar16));
        auVar29._28_4_ = auVar112._28_4_;
        auVar29._0_28_ =
             ZEXT1628(CONCAT412(fVar122 * 0.0,
                                CONCAT48(fVar121 * 0.0,CONCAT44(fVar120 * 0.0,fVar141 * 0.0))));
        fVar141 = auVar118._0_4_;
        fVar120 = auVar118._4_4_;
        fVar121 = auVar118._8_4_;
        fVar122 = auVar118._12_4_;
        fVar123 = auVar118._16_4_;
        fVar124 = auVar118._20_4_;
        fVar125 = auVar118._24_4_;
        auVar30._4_4_ = fVar120 * fVar120 * fVar120 * auVar16._4_4_ * -0.5;
        auVar30._0_4_ = fVar141 * fVar141 * fVar141 * auVar16._0_4_ * -0.5;
        auVar30._8_4_ = fVar121 * fVar121 * fVar121 * auVar16._8_4_ * -0.5;
        auVar30._12_4_ = fVar122 * fVar122 * fVar122 * auVar16._12_4_ * -0.5;
        auVar30._16_4_ = fVar123 * fVar123 * fVar123 * -0.0;
        auVar30._20_4_ = fVar124 * fVar124 * fVar124 * -0.0;
        auVar30._24_4_ = fVar125 * fVar125 * fVar125 * -0.0;
        auVar30._28_4_ = 0;
        auVar16 = vfmadd231ps_fma(auVar30,auVar172,auVar118);
        fVar141 = auVar16._0_4_;
        fVar120 = auVar16._4_4_;
        auVar31._4_4_ = auVar13._4_4_ * fVar120;
        auVar31._0_4_ = auVar13._0_4_ * fVar141;
        fVar121 = auVar16._8_4_;
        auVar31._8_4_ = auVar13._8_4_ * fVar121;
        fVar122 = auVar16._12_4_;
        auVar31._12_4_ = auVar13._12_4_ * fVar122;
        auVar31._16_4_ = auVar13._16_4_ * 0.0;
        auVar31._20_4_ = auVar13._20_4_ * 0.0;
        auVar31._24_4_ = auVar13._24_4_ * 0.0;
        auVar31._28_4_ = 0;
        auVar32._4_4_ = -auVar111._4_4_ * fVar120;
        auVar32._0_4_ = -auVar111._0_4_ * fVar141;
        auVar32._8_4_ = -auVar111._8_4_ * fVar121;
        auVar32._12_4_ = -auVar111._12_4_ * fVar122;
        auVar32._16_4_ = -auVar111._16_4_ * 0.0;
        auVar32._20_4_ = -auVar111._20_4_ * 0.0;
        auVar32._24_4_ = -auVar111._24_4_ * 0.0;
        auVar32._28_4_ = auVar13._28_4_;
        auVar33._28_4_ = auVar118._28_4_;
        auVar33._0_28_ =
             ZEXT1628(CONCAT412(fVar122 * 0.0,
                                CONCAT48(fVar121 * 0.0,CONCAT44(fVar120 * 0.0,fVar141 * 0.0))));
        auVar16 = vfmadd213ps_fma(auVar27,ZEXT1632(auVar107),local_400);
        auVar111 = ZEXT1632(auVar107);
        auVar143 = vfmadd213ps_fma(auVar28,auVar111,_local_460);
        auVar129 = vfmadd213ps_fma(auVar29,auVar111,ZEXT1632(auVar166));
        auVar164 = vfnmadd213ps_fma(auVar27,auVar111,local_400);
        auVar105 = vfmadd213ps_fma(auVar31,ZEXT1632(auVar106),local_420);
        auVar104 = vfnmadd213ps_fma(auVar28,auVar111,_local_460);
        auVar111 = ZEXT1632(auVar106);
        auVar130 = vfmadd213ps_fma(auVar32,auVar111,local_440);
        auVar218 = ZEXT1632(auVar107);
        auVar174 = vfnmadd231ps_fma(ZEXT1632(auVar166),auVar218,auVar29);
        auVar107 = vfmadd213ps_fma(auVar33,auVar111,local_6c0);
        auVar128 = vfnmadd213ps_fma(auVar31,auVar111,local_420);
        auVar163 = vfnmadd213ps_fma(auVar32,auVar111,local_440);
        auVar175 = vfnmadd231ps_fma(local_6c0,ZEXT1632(auVar106),auVar33);
        auVar111 = vsubps_avx(ZEXT1632(auVar130),ZEXT1632(auVar104));
        auVar118 = vsubps_avx(ZEXT1632(auVar107),ZEXT1632(auVar174));
        auVar34._4_4_ = auVar174._4_4_ * auVar111._4_4_;
        auVar34._0_4_ = auVar174._0_4_ * auVar111._0_4_;
        auVar34._8_4_ = auVar174._8_4_ * auVar111._8_4_;
        auVar34._12_4_ = auVar174._12_4_ * auVar111._12_4_;
        auVar34._16_4_ = auVar111._16_4_ * 0.0;
        auVar34._20_4_ = auVar111._20_4_ * 0.0;
        auVar34._24_4_ = auVar111._24_4_ * 0.0;
        auVar34._28_4_ = 0;
        auVar158 = vfmsub231ps_fma(auVar34,ZEXT1632(auVar104),auVar118);
        auVar35._4_4_ = auVar164._4_4_ * auVar118._4_4_;
        auVar35._0_4_ = auVar164._0_4_ * auVar118._0_4_;
        auVar35._8_4_ = auVar164._8_4_ * auVar118._8_4_;
        auVar35._12_4_ = auVar164._12_4_ * auVar118._12_4_;
        auVar35._16_4_ = auVar118._16_4_ * 0.0;
        auVar35._20_4_ = auVar118._20_4_ * 0.0;
        auVar35._24_4_ = auVar118._24_4_ * 0.0;
        auVar35._28_4_ = auVar118._28_4_;
        auVar192 = ZEXT1632(auVar164);
        auVar118 = vsubps_avx(ZEXT1632(auVar105),auVar192);
        auVar166 = vfmsub231ps_fma(auVar35,ZEXT1632(auVar174),auVar118);
        auVar36._4_4_ = auVar104._4_4_ * auVar118._4_4_;
        auVar36._0_4_ = auVar104._0_4_ * auVar118._0_4_;
        auVar36._8_4_ = auVar104._8_4_ * auVar118._8_4_;
        auVar36._12_4_ = auVar104._12_4_ * auVar118._12_4_;
        auVar36._16_4_ = auVar118._16_4_ * 0.0;
        auVar36._20_4_ = auVar118._20_4_ * 0.0;
        auVar36._24_4_ = auVar118._24_4_ * 0.0;
        auVar36._28_4_ = auVar118._28_4_;
        auVar164 = vfmsub231ps_fma(auVar36,auVar192,auVar111);
        auVar166 = vfmadd231ps_fma(ZEXT1632(auVar164),ZEXT832(0) << 0x20,ZEXT1632(auVar166));
        auVar166 = vfmadd231ps_fma(ZEXT1632(auVar166),ZEXT832(0) << 0x20,ZEXT1632(auVar158));
        auVar20 = vcmpps_avx(ZEXT1632(auVar166),ZEXT832(0) << 0x20,2);
        auVar111 = vblendvps_avx(ZEXT1632(auVar128),ZEXT1632(auVar16),auVar20);
        auVar118 = vblendvps_avx(ZEXT1632(auVar163),ZEXT1632(auVar143),auVar20);
        auVar180 = vblendvps_avx(ZEXT1632(auVar175),ZEXT1632(auVar129),auVar20);
        auVar154 = vblendvps_avx(auVar192,ZEXT1632(auVar105),auVar20);
        auVar7 = vblendvps_avx(ZEXT1632(auVar104),ZEXT1632(auVar130),auVar20);
        auVar13 = vblendvps_avx(ZEXT1632(auVar174),ZEXT1632(auVar107),auVar20);
        auVar192 = vblendvps_avx(ZEXT1632(auVar105),auVar192,auVar20);
        auVar112 = vblendvps_avx(ZEXT1632(auVar130),ZEXT1632(auVar104),auVar20);
        auVar166 = vpackssdw_avx(local_4c0._0_16_,local_4c0._16_16_);
        auVar119 = vblendvps_avx(ZEXT1632(auVar107),ZEXT1632(auVar174),auVar20);
        auVar196 = vsubps_avx(auVar192,auVar111);
        auVar112 = vsubps_avx(auVar112,auVar118);
        auVar18 = vsubps_avx(auVar119,auVar180);
        auVar19 = vsubps_avx(auVar111,auVar154);
        auVar131 = vsubps_avx(auVar118,auVar7);
        auVar17 = vsubps_avx(auVar180,auVar13);
        auVar37._4_4_ = auVar18._4_4_ * auVar111._4_4_;
        auVar37._0_4_ = auVar18._0_4_ * auVar111._0_4_;
        auVar37._8_4_ = auVar18._8_4_ * auVar111._8_4_;
        auVar37._12_4_ = auVar18._12_4_ * auVar111._12_4_;
        auVar37._16_4_ = auVar18._16_4_ * auVar111._16_4_;
        auVar37._20_4_ = auVar18._20_4_ * auVar111._20_4_;
        auVar37._24_4_ = auVar18._24_4_ * auVar111._24_4_;
        auVar37._28_4_ = auVar119._28_4_;
        auVar16 = vfmsub231ps_fma(auVar37,auVar180,auVar196);
        auVar38._4_4_ = auVar196._4_4_ * auVar118._4_4_;
        auVar38._0_4_ = auVar196._0_4_ * auVar118._0_4_;
        auVar38._8_4_ = auVar196._8_4_ * auVar118._8_4_;
        auVar38._12_4_ = auVar196._12_4_ * auVar118._12_4_;
        auVar38._16_4_ = auVar196._16_4_ * auVar118._16_4_;
        auVar38._20_4_ = auVar196._20_4_ * auVar118._20_4_;
        auVar38._24_4_ = auVar196._24_4_ * auVar118._24_4_;
        auVar38._28_4_ = auVar192._28_4_;
        auVar107 = vfmsub231ps_fma(auVar38,auVar111,auVar112);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar107),ZEXT832(0) << 0x20,ZEXT1632(auVar16));
        auVar115._0_4_ = auVar112._0_4_ * auVar180._0_4_;
        auVar115._4_4_ = auVar112._4_4_ * auVar180._4_4_;
        auVar115._8_4_ = auVar112._8_4_ * auVar180._8_4_;
        auVar115._12_4_ = auVar112._12_4_ * auVar180._12_4_;
        auVar115._16_4_ = auVar112._16_4_ * auVar180._16_4_;
        auVar115._20_4_ = auVar112._20_4_ * auVar180._20_4_;
        auVar115._24_4_ = auVar112._24_4_ * auVar180._24_4_;
        auVar115._28_4_ = 0;
        auVar107 = vfmsub231ps_fma(auVar115,auVar118,auVar18);
        auVar107 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT832(0) << 0x20,ZEXT1632(auVar107));
        auVar116._0_4_ = auVar17._0_4_ * auVar154._0_4_;
        auVar116._4_4_ = auVar17._4_4_ * auVar154._4_4_;
        auVar116._8_4_ = auVar17._8_4_ * auVar154._8_4_;
        auVar116._12_4_ = auVar17._12_4_ * auVar154._12_4_;
        auVar116._16_4_ = auVar17._16_4_ * auVar154._16_4_;
        auVar116._20_4_ = auVar17._20_4_ * auVar154._20_4_;
        auVar116._24_4_ = auVar17._24_4_ * auVar154._24_4_;
        auVar116._28_4_ = 0;
        auVar16 = vfmsub231ps_fma(auVar116,auVar19,auVar13);
        auVar39._4_4_ = auVar131._4_4_ * auVar13._4_4_;
        auVar39._0_4_ = auVar131._0_4_ * auVar13._0_4_;
        auVar39._8_4_ = auVar131._8_4_ * auVar13._8_4_;
        auVar39._12_4_ = auVar131._12_4_ * auVar13._12_4_;
        auVar39._16_4_ = auVar131._16_4_ * auVar13._16_4_;
        auVar39._20_4_ = auVar131._20_4_ * auVar13._20_4_;
        auVar39._24_4_ = auVar131._24_4_ * auVar13._24_4_;
        auVar39._28_4_ = auVar13._28_4_;
        auVar143 = vfmsub231ps_fma(auVar39,auVar7,auVar17);
        auVar40._4_4_ = auVar19._4_4_ * auVar7._4_4_;
        auVar40._0_4_ = auVar19._0_4_ * auVar7._0_4_;
        auVar40._8_4_ = auVar19._8_4_ * auVar7._8_4_;
        auVar40._12_4_ = auVar19._12_4_ * auVar7._12_4_;
        auVar40._16_4_ = auVar19._16_4_ * auVar7._16_4_;
        auVar40._20_4_ = auVar19._20_4_ * auVar7._20_4_;
        auVar40._24_4_ = auVar19._24_4_ * auVar7._24_4_;
        auVar40._28_4_ = auVar7._28_4_;
        auVar129 = vfmsub231ps_fma(auVar40,auVar131,auVar154);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar129),ZEXT832(0) << 0x20,ZEXT1632(auVar16));
        auVar143 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT832(0) << 0x20,ZEXT1632(auVar143));
        auVar154 = vmaxps_avx(ZEXT1632(auVar107),ZEXT1632(auVar143));
        auVar154 = vcmpps_avx(auVar154,ZEXT832(0) << 0x20,2);
        auVar16 = vpackssdw_avx(auVar154._0_16_,auVar154._16_16_);
        auVar166 = vpand_avx(auVar166,auVar16);
        auVar154 = vpmovsxwd_avx2(auVar166);
        if ((((((((auVar154 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar154 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar154 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar154 >> 0x7f,0) == '\0') &&
              (auVar154 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar154 >> 0xbf,0) == '\0') &&
            (auVar154 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar154[0x1f]) {
          auVar200 = ZEXT864(0) << 0x20;
LAB_015ccf59:
          auVar185 = ZEXT3264(CONCAT824(uStack_5c8,
                                        CONCAT816(uStack_5d0,CONCAT88(uStack_5d8,local_5e0))));
          auVar208 = ZEXT3264(auVar137);
        }
        else {
          auVar41._4_4_ = auVar112._4_4_ * auVar17._4_4_;
          auVar41._0_4_ = auVar112._0_4_ * auVar17._0_4_;
          auVar41._8_4_ = auVar112._8_4_ * auVar17._8_4_;
          auVar41._12_4_ = auVar112._12_4_ * auVar17._12_4_;
          auVar41._16_4_ = auVar112._16_4_ * auVar17._16_4_;
          auVar41._20_4_ = auVar112._20_4_ * auVar17._20_4_;
          auVar41._24_4_ = auVar112._24_4_ * auVar17._24_4_;
          auVar41._28_4_ = auVar154._28_4_;
          auVar130 = vfmsub231ps_fma(auVar41,auVar131,auVar18);
          auVar133._0_4_ = auVar19._0_4_ * auVar18._0_4_;
          auVar133._4_4_ = auVar19._4_4_ * auVar18._4_4_;
          auVar133._8_4_ = auVar19._8_4_ * auVar18._8_4_;
          auVar133._12_4_ = auVar19._12_4_ * auVar18._12_4_;
          auVar133._16_4_ = auVar19._16_4_ * auVar18._16_4_;
          auVar133._20_4_ = auVar19._20_4_ * auVar18._20_4_;
          auVar133._24_4_ = auVar19._24_4_ * auVar18._24_4_;
          auVar133._28_4_ = 0;
          auVar105 = vfmsub231ps_fma(auVar133,auVar196,auVar17);
          auVar42._4_4_ = auVar196._4_4_ * auVar131._4_4_;
          auVar42._0_4_ = auVar196._0_4_ * auVar131._0_4_;
          auVar42._8_4_ = auVar196._8_4_ * auVar131._8_4_;
          auVar42._12_4_ = auVar196._12_4_ * auVar131._12_4_;
          auVar42._16_4_ = auVar196._16_4_ * auVar131._16_4_;
          auVar42._20_4_ = auVar196._20_4_ * auVar131._20_4_;
          auVar42._24_4_ = auVar196._24_4_ * auVar131._24_4_;
          auVar42._28_4_ = auVar196._28_4_;
          auVar158 = vfmsub231ps_fma(auVar42,auVar19,auVar112);
          auVar16 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar105),ZEXT1632(auVar158));
          auVar129 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT1632(auVar130),_DAT_01faff00);
          auVar154 = vrcpps_avx(ZEXT1632(auVar129));
          auVar207._8_4_ = 0x3f800000;
          auVar207._0_8_ = 0x3f8000003f800000;
          auVar207._12_4_ = 0x3f800000;
          auVar207._16_4_ = 0x3f800000;
          auVar207._20_4_ = 0x3f800000;
          auVar207._24_4_ = 0x3f800000;
          auVar207._28_4_ = 0x3f800000;
          auVar16 = vfnmadd213ps_fma(auVar154,ZEXT1632(auVar129),auVar207);
          auVar16 = vfmadd132ps_fma(ZEXT1632(auVar16),auVar154,auVar154);
          auVar43._4_4_ = auVar158._4_4_ * auVar180._4_4_;
          auVar43._0_4_ = auVar158._0_4_ * auVar180._0_4_;
          auVar43._8_4_ = auVar158._8_4_ * auVar180._8_4_;
          auVar43._12_4_ = auVar158._12_4_ * auVar180._12_4_;
          auVar43._16_4_ = auVar180._16_4_ * 0.0;
          auVar43._20_4_ = auVar180._20_4_ * 0.0;
          auVar43._24_4_ = auVar180._24_4_ * 0.0;
          auVar43._28_4_ = auVar180._28_4_;
          auVar105 = vfmadd231ps_fma(auVar43,auVar118,ZEXT1632(auVar105));
          auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),ZEXT1632(auVar130),auVar111);
          fVar141 = auVar16._0_4_;
          fVar120 = auVar16._4_4_;
          fVar121 = auVar16._8_4_;
          fVar122 = auVar16._12_4_;
          auVar44._28_4_ = auVar118._28_4_;
          auVar44._0_28_ =
               ZEXT1628(CONCAT412(fVar122 * auVar105._12_4_,
                                  CONCAT48(fVar121 * auVar105._8_4_,
                                           CONCAT44(fVar120 * auVar105._4_4_,
                                                    fVar141 * auVar105._0_4_))));
          auVar117._4_4_ = uVar95;
          auVar117._0_4_ = uVar95;
          auVar117._8_4_ = uVar95;
          auVar117._12_4_ = uVar95;
          auVar117._16_4_ = uVar95;
          auVar117._20_4_ = uVar95;
          auVar117._24_4_ = uVar95;
          auVar117._28_4_ = uVar95;
          uVar102 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar134._4_4_ = uVar102;
          auVar134._0_4_ = uVar102;
          auVar134._8_4_ = uVar102;
          auVar134._12_4_ = uVar102;
          auVar134._16_4_ = uVar102;
          auVar134._20_4_ = uVar102;
          auVar134._24_4_ = uVar102;
          auVar134._28_4_ = uVar102;
          auVar111 = vcmpps_avx(auVar117,auVar44,2);
          auVar118 = vcmpps_avx(auVar44,auVar134,2);
          auVar111 = vandps_avx(auVar118,auVar111);
          auVar16 = vpackssdw_avx(auVar111._0_16_,auVar111._16_16_);
          auVar166 = vpand_avx(auVar166,auVar16);
          auVar111 = vpmovsxwd_avx2(auVar166);
          auVar200 = ZEXT864(0) << 0x20;
          if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar111 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar111 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar111 >> 0x7f,0) == '\0') &&
                (auVar111 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar111 >> 0xbf,0) == '\0') &&
              (auVar111 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar111[0x1f]) goto LAB_015ccf59;
          auVar111 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT1632(auVar129),4);
          auVar16 = vpackssdw_avx(auVar111._0_16_,auVar111._16_16_);
          auVar166 = vpand_avx(auVar166,auVar16);
          auVar111 = vpmovsxwd_avx2(auVar166);
          auVar185 = ZEXT3264(CONCAT824(uStack_5c8,
                                        CONCAT816(uStack_5d0,CONCAT88(uStack_5d8,local_5e0))));
          auVar208 = ZEXT3264(auVar137);
          if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar111 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar111 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar111 >> 0x7f,0) != '\0') ||
                (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar111 >> 0xbf,0) != '\0') ||
              (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar111[0x1f] < '\0') {
            auVar118 = ZEXT1632(CONCAT412(fVar122 * auVar107._12_4_,
                                          CONCAT48(fVar121 * auVar107._8_4_,
                                                   CONCAT44(fVar120 * auVar107._4_4_,
                                                            fVar141 * auVar107._0_4_))));
            auVar45._28_4_ = local_560._28_4_;
            auVar45._0_28_ =
                 ZEXT1628(CONCAT412(fVar122 * auVar143._12_4_,
                                    CONCAT48(fVar121 * auVar143._8_4_,
                                             CONCAT44(fVar120 * auVar143._4_4_,
                                                      fVar141 * auVar143._0_4_))));
            auVar173._8_4_ = 0x3f800000;
            auVar173._0_8_ = 0x3f8000003f800000;
            auVar173._12_4_ = 0x3f800000;
            auVar173._16_4_ = 0x3f800000;
            auVar173._20_4_ = 0x3f800000;
            auVar173._24_4_ = 0x3f800000;
            auVar173._28_4_ = 0x3f800000;
            auVar137 = vsubps_avx(auVar173,auVar118);
            auVar137 = vblendvps_avx(auVar137,auVar118,auVar20);
            auVar208 = ZEXT3264(auVar137);
            auVar137 = vsubps_avx(auVar173,auVar45);
            local_4e0 = vblendvps_avx(auVar137,auVar45,auVar20);
            auVar185 = ZEXT3264(auVar111);
            local_560 = auVar44;
          }
        }
        auVar139 = ZEXT3264(auVar159);
        auVar214 = ZEXT3264(_local_700);
        auVar111 = auVar185._0_32_;
        if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar111 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar111 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar111 >> 0x7f,0) == '\0') &&
              (auVar185 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar111 >> 0xbf,0) == '\0') &&
            (auVar185 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar185[0x1f]) {
          uVar96 = 0;
          auVar189 = ZEXT3264(CONCAT428(fVar209,CONCAT424(fVar209,CONCAT420(fVar209,CONCAT416(
                                                  fVar209,CONCAT412(fVar209,CONCAT48(fVar209,
                                                  CONCAT44(fVar209,fVar209))))))));
          auVar185 = ZEXT3264(CONCAT428(fVar162,CONCAT424(fVar157,CONCAT420(fVar162,CONCAT416(
                                                  fVar157,CONCAT412(fVar162,CONCAT48(fVar157,uVar103
                                                                                    )))))));
        }
        else {
          auVar137 = vsubps_avx(ZEXT1632(auVar106),auVar218);
          auVar180 = auVar208._0_32_;
          auVar166 = vfmadd213ps_fma(auVar137,auVar180,auVar218);
          fVar141 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
          auVar137._4_4_ = (auVar166._4_4_ + auVar166._4_4_) * fVar141;
          auVar137._0_4_ = (auVar166._0_4_ + auVar166._0_4_) * fVar141;
          auVar137._8_4_ = (auVar166._8_4_ + auVar166._8_4_) * fVar141;
          auVar137._12_4_ = (auVar166._12_4_ + auVar166._12_4_) * fVar141;
          auVar137._16_4_ = fVar141 * 0.0;
          auVar137._20_4_ = fVar141 * 0.0;
          auVar137._24_4_ = fVar141 * 0.0;
          auVar137._28_4_ = 0;
          auVar137 = vcmpps_avx(local_560,auVar137,6);
          auVar118 = auVar111 & auVar137;
          auVar189 = ZEXT3264(CONCAT428(fVar209,CONCAT424(fVar209,CONCAT420(fVar209,CONCAT416(
                                                  fVar209,CONCAT412(fVar209,CONCAT48(fVar209,
                                                  CONCAT44(fVar209,fVar209))))))));
          auVar185 = ZEXT3264(CONCAT428(fVar162,CONCAT424(fVar157,CONCAT420(fVar162,CONCAT416(
                                                  fVar157,CONCAT412(fVar162,CONCAT48(fVar157,uVar103
                                                                                    )))))));
          if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar118 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar118 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar118 >> 0x7f,0) == '\0') &&
                (auVar118 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar118 >> 0xbf,0) == '\0') &&
              (auVar118 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar118[0x1f]) {
            uVar96 = 0;
          }
          else {
            auVar135._8_4_ = 0xbf800000;
            auVar135._0_8_ = 0xbf800000bf800000;
            auVar135._12_4_ = 0xbf800000;
            auVar135._16_4_ = 0xbf800000;
            auVar135._20_4_ = 0xbf800000;
            auVar135._24_4_ = 0xbf800000;
            auVar135._28_4_ = 0xbf800000;
            auVar151._8_4_ = 0x40000000;
            auVar151._0_8_ = 0x4000000040000000;
            auVar151._12_4_ = 0x40000000;
            auVar151._16_4_ = 0x40000000;
            auVar151._20_4_ = 0x40000000;
            auVar151._24_4_ = 0x40000000;
            auVar151._28_4_ = 0x40000000;
            auVar166 = vfmadd213ps_fma(local_4e0,auVar151,auVar135);
            local_380 = ZEXT1632(auVar166);
            local_340 = 0;
            local_320 = local_740;
            uStack_318 = uStack_738;
            local_310 = local_750;
            uStack_308 = uStack_748;
            local_4e0 = local_380;
            if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) goto LAB_015cb414;
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (uVar96 = CONCAT71((int7)((ulong)context->args >> 8),1),
               pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar111 = vandps_avx(auVar137,auVar111);
              fVar141 = 1.0 / auVar113._0_4_;
              local_2c0[0] = fVar141 * (auVar208._0_4_ + 0.0);
              local_2c0[1] = fVar141 * (auVar208._4_4_ + 1.0);
              local_2c0[2] = fVar141 * (auVar208._8_4_ + 2.0);
              local_2c0[3] = fVar141 * (auVar208._12_4_ + 3.0);
              fStack_2b0 = fVar141 * (auVar208._16_4_ + 4.0);
              fStack_2ac = fVar141 * (auVar208._20_4_ + 5.0);
              fStack_2a8 = fVar141 * (auVar208._24_4_ + 6.0);
              fStack_2a4 = auVar208._28_4_ + 7.0;
              local_4e0._0_8_ = auVar166._0_8_;
              local_4e0._8_8_ = auVar166._8_8_;
              local_2a0 = local_4e0._0_8_;
              uStack_298 = local_4e0._8_8_;
              uStack_290 = 0;
              uStack_288 = 0;
              local_280 = local_560;
              uVar95 = vmovmskps_avx(auVar111);
              if (uVar95 == 0) {
                uVar96 = 0;
              }
              else {
                uVar97 = 0;
                local_920._0_8_ = ZEXT48(uVar95 & 0xff);
                for (uVar96 = local_920._0_8_; (uVar96 & 1) == 0;
                    uVar96 = uVar96 >> 1 | 0x8000000000000000) {
                  uVar97 = uVar97 + 1;
                }
                local_6c0._4_4_ = uVar98;
                local_6c0._0_4_ = uVar98;
                local_6c0._8_4_ = uVar98;
                local_6c0._12_4_ = uVar98;
                local_6c0._16_4_ = uVar98;
                local_6c0._20_4_ = uVar98;
                local_6c0._24_4_ = uVar98;
                local_6c0._28_4_ = uVar98;
                local_900 = CONCAT44(local_540,local_540);
                uStack_8f8._0_4_ = local_540;
                uStack_8f8._4_4_ = local_540;
                uStack_8f0._0_4_ = local_540;
                uStack_8f0._4_4_ = local_540;
                auVar92 = _local_900;
                uStack_8e8._0_4_ = local_540;
                uStack_8e8._4_4_ = local_540;
                auVar111 = _local_900;
                local_640 = ZEXT1632(CONCAT124(auVar106._4_12_,*(undefined4 *)(ray + k * 4 + 0x100))
                                    );
                local_6a0 = auVar159;
                local_3a0 = auVar180;
                local_360 = local_560;
                local_33c = iVar94;
                local_330 = uVar87;
                uStack_328 = uVar88;
                do {
                  fVar141 = local_2c0[uVar97];
                  auVar109._4_4_ = fVar141;
                  auVar109._0_4_ = fVar141;
                  auVar109._8_4_ = fVar141;
                  auVar109._12_4_ = fVar141;
                  local_200._16_4_ = fVar141;
                  local_200._0_16_ = auVar109;
                  local_200._20_4_ = fVar141;
                  local_200._24_4_ = fVar141;
                  local_200._28_4_ = fVar141;
                  local_1e0 = *(undefined4 *)((long)&local_2a0 + uVar97 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_280 + uVar97 * 4);
                  fVar121 = 1.0 - fVar141;
                  auVar166 = ZEXT416((uint)(fVar141 * fVar121 * 4.0));
                  auVar16 = vfnmsub213ss_fma(auVar109,auVar109,auVar166);
                  auVar166 = vfmadd213ss_fma(ZEXT416((uint)fVar121),ZEXT416((uint)fVar121),auVar166)
                  ;
                  fVar120 = auVar166._0_4_ * 0.5;
                  fVar141 = fVar141 * fVar141 * 0.5;
                  auVar167._0_4_ = fVar141 * (float)local_5f0._0_4_;
                  auVar167._4_4_ = fVar141 * (float)local_5f0._4_4_;
                  auVar167._8_4_ = fVar141 * fStack_5e8;
                  auVar167._12_4_ = fVar141 * fStack_5e4;
                  auVar144._4_4_ = fVar120;
                  auVar144._0_4_ = fVar120;
                  auVar144._8_4_ = fVar120;
                  auVar144._12_4_ = fVar120;
                  auVar166 = vfmadd132ps_fma(auVar144,auVar167,auVar15);
                  fVar141 = auVar16._0_4_ * 0.5;
                  auVar168._4_4_ = fVar141;
                  auVar168._0_4_ = fVar141;
                  auVar168._8_4_ = fVar141;
                  auVar168._12_4_ = fVar141;
                  auVar166 = vfmadd132ps_fma(auVar168,auVar166,auVar14);
                  local_730.context = context->user;
                  fVar141 = fVar121 * -fVar121 * 0.5;
                  auVar145._4_4_ = fVar141;
                  auVar145._0_4_ = fVar141;
                  auVar145._8_4_ = fVar141;
                  auVar145._12_4_ = fVar141;
                  auVar16 = vfmadd132ps_fma(auVar145,auVar166,auVar169);
                  local_260 = auVar16._0_4_;
                  uStack_25c = local_260;
                  uStack_258 = local_260;
                  uStack_254 = local_260;
                  uStack_250 = local_260;
                  uStack_24c = local_260;
                  uStack_248 = local_260;
                  uStack_244 = local_260;
                  auVar166 = vmovshdup_avx(auVar16);
                  local_240 = auVar166._0_8_;
                  uStack_238 = local_240;
                  uStack_230 = local_240;
                  uStack_228 = local_240;
                  auVar166 = vshufps_avx(auVar16,auVar16,0xaa);
                  auVar146._0_8_ = auVar166._0_8_;
                  auVar146._8_8_ = auVar146._0_8_;
                  auVar152._16_8_ = auVar146._0_8_;
                  auVar152._0_16_ = auVar146;
                  auVar152._24_8_ = auVar146._0_8_;
                  local_220 = auVar152;
                  uStack_1dc = local_1e0;
                  uStack_1d8 = local_1e0;
                  uStack_1d4 = local_1e0;
                  uStack_1d0 = local_1e0;
                  uStack_1cc = local_1e0;
                  uStack_1c8 = local_1e0;
                  uStack_1c4 = local_1e0;
                  uStack_8f0 = auVar92._16_8_;
                  uStack_8e8 = auVar111._24_8_;
                  local_1c0 = local_900;
                  uStack_1b8 = uStack_8f8;
                  uStack_1b0 = uStack_8f0;
                  uStack_1a8 = uStack_8e8;
                  local_1a0 = local_6c0;
                  vpcmpeqd_avx2(local_6c0,local_6c0);
                  local_180 = (local_730.context)->instID[0];
                  uStack_17c = local_180;
                  uStack_178 = local_180;
                  uStack_174 = local_180;
                  uStack_170 = local_180;
                  uStack_16c = local_180;
                  uStack_168 = local_180;
                  uStack_164 = local_180;
                  local_160 = (local_730.context)->instPrimID[0];
                  uStack_15c = local_160;
                  uStack_158 = local_160;
                  uStack_154 = local_160;
                  uStack_150 = local_160;
                  uStack_14c = local_160;
                  uStack_148 = local_160;
                  uStack_144 = local_160;
                  local_620 = local_3c0;
                  local_730.valid = (int *)local_620;
                  local_730.geometryUserPtr = *(void **)(CONCAT44(uStack_5bc,local_5c0) + 0x18);
                  local_730.hit = (RTCHitN *)&local_260;
                  local_730.N = 8;
                  pcVar10 = *(code **)(CONCAT44(uStack_5bc,local_5c0) + 0x48);
                  local_730.ray = (RTCRayN *)ray;
                  if (pcVar10 != (code *)0x0) {
                    auVar152 = ZEXT1632(auVar146);
                    (*pcVar10)(&local_730);
                    auVar214 = ZEXT3264(_local_700);
                    auVar139 = ZEXT3264(local_6a0);
                    auVar189 = ZEXT3264(CONCAT428(fVar209,CONCAT424(fVar209,CONCAT420(fVar209,
                                                  CONCAT416(fVar209,CONCAT412(fVar209,CONCAT48(
                                                  fVar209,CONCAT44(fVar209,fVar209))))))));
                    auVar208 = ZEXT3264(auVar180);
                    auVar200 = ZEXT1664(ZEXT816(0) << 0x40);
                  }
                  auVar118 = vpcmpeqd_avx2(auVar200._0_32_,local_620);
                  auVar154 = vpcmpeqd_avx2(auVar152,auVar152);
                  auVar137 = auVar154 & ~auVar118;
                  if ((((((((auVar137 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar137 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar137 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar137 >> 0x7f,0) == '\0') &&
                        (auVar137 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar137 >> 0xbf,0) == '\0') &&
                      (auVar137 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar137[0x1f]) {
                    auVar118 = auVar118 ^ auVar154;
                  }
                  else {
                    p_Var11 = context->args->filter;
                    if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        ((*(byte *)(CONCAT44(uStack_5bc,local_5c0) + 0x3e) & 0x40) != 0)))) {
                      (*p_Var11)(&local_730);
                      auVar214 = ZEXT3264(_local_700);
                      auVar139 = ZEXT3264(local_6a0);
                      auVar189 = ZEXT3264(CONCAT428(fVar209,CONCAT424(fVar209,CONCAT420(fVar209,
                                                  CONCAT416(fVar209,CONCAT412(fVar209,CONCAT48(
                                                  fVar209,CONCAT44(fVar209,fVar209))))))));
                      auVar208 = ZEXT3264(auVar180);
                      auVar200 = ZEXT1664(ZEXT816(0) << 0x40);
                    }
                    auVar137 = vpcmpeqd_avx2(auVar200._0_32_,local_620);
                    auVar118 = vpcmpeqd_avx2(local_620,local_620);
                    auVar118 = auVar137 ^ auVar118;
                    auVar153._8_4_ = 0xff800000;
                    auVar153._0_8_ = 0xff800000ff800000;
                    auVar153._12_4_ = 0xff800000;
                    auVar153._16_4_ = 0xff800000;
                    auVar153._20_4_ = 0xff800000;
                    auVar153._24_4_ = 0xff800000;
                    auVar153._28_4_ = 0xff800000;
                    auVar137 = vblendvps_avx(auVar153,*(undefined1 (*) [32])(local_730.ray + 0x100),
                                             auVar137);
                    *(undefined1 (*) [32])(local_730.ray + 0x100) = auVar137;
                  }
                  auVar159 = auVar139._0_32_;
                  auVar185 = ZEXT3264(CONCAT428(fVar162,CONCAT424(fVar157,CONCAT420(fVar162,
                                                  CONCAT416(fVar157,CONCAT412(fVar162,CONCAT48(
                                                  fVar157,uVar103)))))));
                  if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar118 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar118 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar118 >> 0x7f,0) != '\0') ||
                        (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar118 >> 0xbf,0) != '\0') ||
                      (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar118[0x1f] < '\0') {
                    uVar96 = CONCAT71((int7)(uVar97 >> 8),1);
                    break;
                  }
                  *(undefined4 *)(ray + k * 4 + 0x100) = local_640._0_4_;
                  uVar100 = uVar97 & 0x3f;
                  uVar96 = 0;
                  uVar97 = 0;
                  local_920._0_8_ = local_920._0_8_ ^ 1L << uVar100;
                  for (uVar100 = local_920._0_8_; (uVar100 & 1) == 0;
                      uVar100 = uVar100 >> 1 | 0x8000000000000000) {
                    uVar97 = uVar97 + 1;
                  }
                } while (local_920._0_8_ != 0);
              }
            }
          }
        }
      }
      uVar95 = (uint)uVar96;
      auVar139 = ZEXT3264(local_680);
      auVar200 = ZEXT3264(local_6e0);
      if (8 < iVar94) {
        local_4a0._4_4_ = iVar94;
        local_4a0._0_4_ = iVar94;
        local_4a0._8_4_ = iVar94;
        local_4a0._12_4_ = iVar94;
        local_4a0._16_4_ = iVar94;
        local_4a0._20_4_ = iVar94;
        local_4a0._24_4_ = iVar94;
        local_4a0._28_4_ = iVar94;
        local_4c0._4_4_ = fVar142;
        local_4c0._0_4_ = fVar142;
        fStack_4b8 = fVar142;
        fStack_4b4 = fVar142;
        fStack_4b0 = fVar142;
        fStack_4ac = fVar142;
        fStack_4a8 = fVar142;
        fStack_4a4 = fVar142;
        local_5c0 = local_660._0_4_;
        uStack_5bc = local_660._0_4_;
        uStack_5b8 = local_660._0_4_;
        uStack_5b4 = local_660._0_4_;
        uStack_5b0 = local_660._0_4_;
        uStack_5ac = local_660._0_4_;
        uStack_5a8 = local_660._0_4_;
        uStack_5a4 = local_660._0_4_;
        local_140 = 1.0 / (float)local_520._0_4_;
        fStack_13c = local_140;
        fStack_138 = local_140;
        fStack_134 = local_140;
        fStack_130 = local_140;
        fStack_12c = local_140;
        fStack_128 = local_140;
        fStack_124 = local_140;
        local_120 = uVar98;
        uStack_11c = uVar98;
        uStack_118 = uVar98;
        uStack_114 = uVar98;
        uStack_110 = uVar98;
        uStack_10c = uVar98;
        uStack_108 = uVar98;
        uStack_104 = uVar98;
        uStack_53c = local_540;
        uStack_538 = local_540;
        uStack_534 = local_540;
        uStack_530 = local_540;
        uStack_52c = local_540;
        uStack_528 = local_540;
        uStack_524 = local_540;
        lVar101 = 8;
        auVar111 = auVar208._0_32_;
        _local_700 = auVar214._0_32_;
        local_6a0 = auVar159;
        do {
          local_6c0._0_4_ = (int)uVar96;
          auVar196 = auVar200._0_32_;
          local_680 = auVar139._0_32_;
          auVar137 = *(undefined1 (*) [32])(bspline_basis0 + lVar101 * 4 + lVar21);
          auVar118 = *(undefined1 (*) [32])(lVar21 + 0x21aefac + lVar101 * 4);
          auVar180 = *(undefined1 (*) [32])(lVar21 + 0x21af430 + lVar101 * 4);
          pauVar2 = (undefined1 (*) [32])(lVar21 + 0x21af8b4 + lVar101 * 4);
          fVar125 = *(float *)*pauVar2;
          fVar76 = *(float *)(*pauVar2 + 4);
          fVar77 = *(float *)(*pauVar2 + 8);
          fVar78 = *(float *)(*pauVar2 + 0xc);
          fVar79 = *(float *)(*pauVar2 + 0x10);
          fVar80 = *(float *)(*pauVar2 + 0x14);
          fVar81 = *(float *)(*pauVar2 + 0x18);
          auVar90 = *(undefined1 (*) [28])*pauVar2;
          auVar213._0_4_ = fVar125 * auVar189._0_4_;
          auVar213._4_4_ = fVar76 * auVar189._4_4_;
          auVar213._8_4_ = fVar77 * auVar189._8_4_;
          auVar213._12_4_ = fVar78 * auVar189._12_4_;
          auVar213._16_4_ = fVar79 * auVar189._16_4_;
          auVar213._20_4_ = fVar80 * auVar189._20_4_;
          auVar213._28_36_ = auVar214._28_36_;
          auVar213._24_4_ = fVar81 * auVar189._24_4_;
          auVar200._0_4_ = fVar125 * auVar185._0_4_;
          auVar200._4_4_ = fVar76 * auVar185._4_4_;
          auVar200._8_4_ = fVar77 * auVar185._8_4_;
          auVar200._12_4_ = fVar78 * auVar185._12_4_;
          auVar200._16_4_ = fVar79 * auVar185._16_4_;
          auVar200._20_4_ = fVar80 * auVar185._20_4_;
          auVar200._28_36_ = auVar139._28_36_;
          auVar200._24_4_ = fVar81 * auVar185._24_4_;
          auVar169 = vfmadd231ps_fma(auVar213._0_32_,auVar180,auVar149);
          auVar166 = vfmadd231ps_fma(auVar200._0_32_,auVar180,auVar206);
          auVar169 = vfmadd231ps_fma(ZEXT1632(auVar169),auVar118,auVar202);
          auVar166 = vfmadd231ps_fma(ZEXT1632(auVar166),auVar118,auVar220);
          auVar169 = vfmadd231ps_fma(ZEXT1632(auVar169),auVar137,auVar217);
          auVar166 = vfmadd231ps_fma(ZEXT1632(auVar166),auVar137,local_5a0);
          auVar154 = *(undefined1 (*) [32])(bspline_basis1 + lVar101 * 4 + lVar21);
          auVar7 = *(undefined1 (*) [32])(lVar21 + 0x21b13cc + lVar101 * 4);
          auVar13 = *(undefined1 (*) [32])(lVar21 + 0x21b1850 + lVar101 * 4);
          pauVar3 = (undefined1 (*) [32])(lVar21 + 0x21b1cd4 + lVar101 * 4);
          fVar126 = *(float *)*pauVar3;
          fVar140 = *(float *)(*pauVar3 + 4);
          fVar82 = *(float *)(*pauVar3 + 8);
          fVar83 = *(float *)(*pauVar3 + 0xc);
          fVar84 = *(float *)(*pauVar3 + 0x10);
          fVar85 = *(float *)(*pauVar3 + 0x14);
          fVar86 = *(float *)(*pauVar3 + 0x18);
          auVar91 = *(undefined1 (*) [28])*pauVar3;
          auVar214._0_4_ = fVar126 * auVar189._0_4_;
          auVar214._4_4_ = fVar140 * auVar189._4_4_;
          auVar214._8_4_ = fVar82 * auVar189._8_4_;
          auVar214._12_4_ = fVar83 * auVar189._12_4_;
          auVar214._16_4_ = fVar84 * auVar189._16_4_;
          auVar214._20_4_ = fVar85 * auVar189._20_4_;
          auVar214._28_36_ = auVar189._28_36_;
          auVar214._24_4_ = fVar86 * auVar189._24_4_;
          auVar46._4_4_ = fVar140 * auVar185._4_4_;
          auVar46._0_4_ = fVar126 * auVar185._0_4_;
          auVar46._8_4_ = fVar82 * auVar185._8_4_;
          auVar46._12_4_ = fVar83 * auVar185._12_4_;
          auVar46._16_4_ = fVar84 * auVar185._16_4_;
          auVar46._20_4_ = fVar85 * auVar185._20_4_;
          auVar46._24_4_ = fVar86 * auVar185._24_4_;
          auVar46._28_4_ = auVar137._28_4_;
          auVar16 = vfmadd231ps_fma(auVar214._0_32_,auVar13,auVar149);
          auVar107 = vfmadd231ps_fma(auVar46,auVar13,auVar206);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar7,auVar202);
          auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar7,auVar220);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar154,auVar217);
          auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar154,local_5a0);
          local_440 = ZEXT1632(auVar16);
          local_400 = ZEXT1632(auVar169);
          auVar112 = vsubps_avx(local_440,local_400);
          local_640 = ZEXT1632(auVar107);
          local_660 = ZEXT1632(auVar166);
          local_420 = vsubps_avx(local_640,local_660);
          auVar47._4_4_ = auVar112._4_4_ * auVar166._4_4_;
          auVar47._0_4_ = auVar112._0_4_ * auVar166._0_4_;
          auVar47._8_4_ = auVar112._8_4_ * auVar166._8_4_;
          auVar47._12_4_ = auVar112._12_4_ * auVar166._12_4_;
          auVar47._16_4_ = auVar112._16_4_ * 0.0;
          auVar47._20_4_ = auVar112._20_4_ * 0.0;
          auVar47._24_4_ = auVar112._24_4_ * 0.0;
          auVar47._28_4_ = auVar13._28_4_;
          fVar142 = local_420._0_4_;
          auVar136._0_4_ = auVar169._0_4_ * fVar142;
          fVar141 = local_420._4_4_;
          auVar136._4_4_ = auVar169._4_4_ * fVar141;
          fVar120 = local_420._8_4_;
          auVar136._8_4_ = auVar169._8_4_ * fVar120;
          fVar121 = local_420._12_4_;
          auVar136._12_4_ = auVar169._12_4_ * fVar121;
          fVar122 = local_420._16_4_;
          auVar136._16_4_ = fVar122 * 0.0;
          fVar123 = local_420._20_4_;
          auVar136._20_4_ = fVar123 * 0.0;
          fVar124 = local_420._24_4_;
          auVar136._24_4_ = fVar124 * 0.0;
          auVar136._28_4_ = 0;
          auVar214 = ZEXT3264(auVar180);
          auVar119 = vsubps_avx(auVar47,auVar136);
          auVar139._0_4_ = fVar125 * (float)local_e0;
          auVar139._4_4_ = fVar76 * local_e0._4_4_;
          auVar139._8_4_ = fVar77 * (float)uStack_d8;
          auVar139._12_4_ = fVar78 * uStack_d8._4_4_;
          auVar139._16_4_ = fVar79 * (float)uStack_d0;
          auVar139._20_4_ = fVar80 * uStack_d0._4_4_;
          auVar139._28_36_ = auVar185._28_36_;
          auVar139._24_4_ = fVar81 * (float)uStack_c8;
          auVar169 = vfmadd231ps_fma(auVar139._0_32_,auVar180,local_c0);
          auVar169 = vfmadd231ps_fma(ZEXT1632(auVar169),auVar118,local_a0);
          auVar169 = vfmadd231ps_fma(ZEXT1632(auVar169),local_80,auVar137);
          auVar48._4_4_ = fVar140 * local_e0._4_4_;
          auVar48._0_4_ = fVar126 * (float)local_e0;
          auVar48._8_4_ = fVar82 * (float)uStack_d8;
          auVar48._12_4_ = fVar83 * uStack_d8._4_4_;
          auVar48._16_4_ = fVar84 * (float)uStack_d0;
          auVar48._20_4_ = fVar85 * uStack_d0._4_4_;
          auVar48._24_4_ = fVar86 * (float)uStack_c8;
          auVar48._28_4_ = uStack_c8._4_4_;
          auVar16 = vfmadd231ps_fma(auVar48,auVar13,local_c0);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar7,local_a0);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar154,local_80);
          auVar49._4_4_ = fVar141 * fVar141;
          auVar49._0_4_ = fVar142 * fVar142;
          auVar49._8_4_ = fVar120 * fVar120;
          auVar49._12_4_ = fVar121 * fVar121;
          auVar49._16_4_ = fVar122 * fVar122;
          auVar49._20_4_ = fVar123 * fVar123;
          auVar49._24_4_ = fVar124 * fVar124;
          auVar49._28_4_ = local_80._28_4_;
          auVar107 = vfmadd231ps_fma(auVar49,auVar112,auVar112);
          auVar192 = vmaxps_avx(ZEXT1632(auVar169),ZEXT1632(auVar16));
          auVar197._0_4_ = auVar192._0_4_ * auVar192._0_4_ * auVar107._0_4_;
          auVar197._4_4_ = auVar192._4_4_ * auVar192._4_4_ * auVar107._4_4_;
          auVar197._8_4_ = auVar192._8_4_ * auVar192._8_4_ * auVar107._8_4_;
          auVar197._12_4_ = auVar192._12_4_ * auVar192._12_4_ * auVar107._12_4_;
          auVar197._16_4_ = auVar192._16_4_ * auVar192._16_4_ * 0.0;
          auVar197._20_4_ = auVar192._20_4_ * auVar192._20_4_ * 0.0;
          auVar197._24_4_ = auVar192._24_4_ * auVar192._24_4_ * 0.0;
          auVar197._28_4_ = 0;
          auVar50._4_4_ = auVar119._4_4_ * auVar119._4_4_;
          auVar50._0_4_ = auVar119._0_4_ * auVar119._0_4_;
          auVar50._8_4_ = auVar119._8_4_ * auVar119._8_4_;
          auVar50._12_4_ = auVar119._12_4_ * auVar119._12_4_;
          auVar50._16_4_ = auVar119._16_4_ * auVar119._16_4_;
          auVar50._20_4_ = auVar119._20_4_ * auVar119._20_4_;
          auVar50._24_4_ = auVar119._24_4_ * auVar119._24_4_;
          auVar50._28_4_ = auVar119._28_4_;
          auVar192 = vcmpps_avx(auVar50,auVar197,2);
          local_340 = (int)lVar101;
          auVar198._4_4_ = local_340;
          auVar198._0_4_ = local_340;
          auVar198._8_4_ = local_340;
          auVar198._12_4_ = local_340;
          auVar198._16_4_ = local_340;
          auVar198._20_4_ = local_340;
          auVar198._24_4_ = local_340;
          auVar198._28_4_ = local_340;
          auVar119 = vpor_avx2(auVar198,_DAT_01fe9900);
          auVar20 = vpcmpgtd_avx2(local_4a0,auVar119);
          auVar119 = auVar20 & auVar192;
          if ((((((((auVar119 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar119 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar119 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar119 >> 0x7f,0) == '\0') &&
                (auVar119 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar119 >> 0xbf,0) == '\0') &&
              (auVar119 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar119[0x1f]) {
            auVar139 = ZEXT3264(local_680);
            auVar200 = ZEXT3264(auVar196);
            auVar189 = ZEXT3264(CONCAT428(fVar209,CONCAT424(fVar209,CONCAT420(fVar209,CONCAT416(
                                                  fVar209,CONCAT412(fVar209,CONCAT48(fVar209,
                                                  CONCAT44(fVar209,fVar209))))))));
            auVar185 = ZEXT3264(CONCAT428(fVar162,CONCAT424(fVar157,CONCAT420(fVar162,CONCAT416(
                                                  fVar157,CONCAT412(fVar162,CONCAT48(fVar157,uVar103
                                                                                    )))))));
            uVar96 = uVar96 & 0xffffffff;
          }
          else {
            local_520 = vandps_avx(auVar20,auVar192);
            local_480._0_4_ = auVar91._0_4_;
            local_480._4_4_ = auVar91._4_4_;
            fStack_478 = auVar91._8_4_;
            fStack_474 = auVar91._12_4_;
            fStack_470 = auVar91._16_4_;
            fStack_46c = auVar91._20_4_;
            fStack_468 = auVar91._24_4_;
            auVar51._4_4_ = (float)local_700._4_4_ * (float)local_480._4_4_;
            auVar51._0_4_ = (float)local_700._0_4_ * (float)local_480._0_4_;
            auVar51._8_4_ = fStack_6f8 * fStack_478;
            auVar51._12_4_ = fStack_6f4 * fStack_474;
            auVar51._16_4_ = fStack_6f0 * fStack_470;
            auVar51._20_4_ = fStack_6ec * fStack_46c;
            auVar51._24_4_ = fStack_6e8 * fStack_468;
            auVar51._28_4_ = auVar192._28_4_;
            auVar107 = vfmadd213ps_fma(auVar13,local_580,auVar51);
            auVar107 = vfmadd213ps_fma(auVar7,local_100,ZEXT1632(auVar107));
            auVar107 = vfmadd132ps_fma(auVar154,ZEXT1632(auVar107),local_6a0);
            local_460._0_4_ = auVar90._0_4_;
            local_460._4_4_ = auVar90._4_4_;
            fStack_458 = auVar90._8_4_;
            fStack_454 = auVar90._12_4_;
            fStack_450 = auVar90._16_4_;
            fStack_44c = auVar90._20_4_;
            fStack_448 = auVar90._24_4_;
            auVar160._0_4_ = (float)local_700._0_4_ * (float)local_460._0_4_;
            auVar160._4_4_ = (float)local_700._4_4_ * (float)local_460._4_4_;
            auVar160._8_4_ = fStack_6f8 * fStack_458;
            auVar160._12_4_ = fStack_6f4 * fStack_454;
            auVar160._16_4_ = fStack_6f0 * fStack_450;
            auVar160._20_4_ = fStack_6ec * fStack_44c;
            auVar160._24_4_ = fStack_6e8 * fStack_448;
            auVar160._28_4_ = 0;
            auVar106 = vfmadd213ps_fma(auVar180,local_580,auVar160);
            auVar106 = vfmadd213ps_fma(auVar118,local_100,ZEXT1632(auVar106));
            auVar118 = *(undefined1 (*) [32])(lVar21 + 0x21afd38 + lVar101 * 4);
            auVar180 = *(undefined1 (*) [32])(lVar21 + 0x21b01bc + lVar101 * 4);
            auVar154 = *(undefined1 (*) [32])(lVar21 + 0x21b0640 + lVar101 * 4);
            pfVar4 = (float *)(lVar21 + 0x21b0ac4 + lVar101 * 4);
            fVar142 = *pfVar4;
            fVar141 = pfVar4[1];
            fVar120 = pfVar4[2];
            fVar121 = pfVar4[3];
            fVar122 = pfVar4[4];
            fVar123 = pfVar4[5];
            fVar124 = pfVar4[6];
            auVar52._4_4_ = fVar209 * fVar141;
            auVar52._0_4_ = fVar209 * fVar142;
            auVar52._8_4_ = fVar209 * fVar120;
            auVar52._12_4_ = fVar209 * fVar121;
            auVar52._16_4_ = fVar209 * fVar122;
            auVar52._20_4_ = fVar209 * fVar123;
            auVar52._24_4_ = fVar209 * fVar124;
            auVar52._28_4_ = auVar112._28_4_;
            auVar211._0_4_ = fVar157 * fVar142;
            auVar211._4_4_ = fVar162 * fVar141;
            auVar211._8_4_ = fVar157 * fVar120;
            auVar211._12_4_ = fVar162 * fVar121;
            auVar211._16_4_ = fVar157 * fVar122;
            auVar211._20_4_ = fVar162 * fVar123;
            auVar211._24_4_ = fVar157 * fVar124;
            auVar211._28_4_ = 0;
            auVar53._4_4_ = fVar141 * (float)local_700._4_4_;
            auVar53._0_4_ = fVar142 * (float)local_700._0_4_;
            auVar53._8_4_ = fVar120 * fStack_6f8;
            auVar53._12_4_ = fVar121 * fStack_6f4;
            auVar53._16_4_ = fVar122 * fStack_6f0;
            auVar53._20_4_ = fVar123 * fStack_6ec;
            auVar53._24_4_ = fVar124 * fStack_6e8;
            auVar53._28_4_ = pfVar4[7];
            auVar143 = vfmadd231ps_fma(auVar52,auVar154,auVar149);
            auVar129 = vfmadd231ps_fma(auVar211,auVar154,auVar206);
            auVar105 = vfmadd231ps_fma(auVar53,local_580,auVar154);
            auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),auVar180,auVar202);
            auVar129 = vfmadd231ps_fma(ZEXT1632(auVar129),auVar180,auVar220);
            auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),local_100,auVar180);
            auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),auVar118,auVar217);
            auVar129 = vfmadd231ps_fma(ZEXT1632(auVar129),auVar118,local_5a0);
            auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),local_6a0,auVar118);
            pfVar4 = (float *)(lVar21 + 0x21b2ee4 + lVar101 * 4);
            fVar142 = *pfVar4;
            fVar141 = pfVar4[1];
            fVar120 = pfVar4[2];
            fVar121 = pfVar4[3];
            fVar122 = pfVar4[4];
            fVar123 = pfVar4[5];
            fVar124 = pfVar4[6];
            auVar54._4_4_ = fVar209 * fVar141;
            auVar54._0_4_ = fVar209 * fVar142;
            auVar54._8_4_ = fVar209 * fVar120;
            auVar54._12_4_ = fVar209 * fVar121;
            auVar54._16_4_ = fVar209 * fVar122;
            auVar54._20_4_ = fVar209 * fVar123;
            auVar54._24_4_ = fVar209 * fVar124;
            auVar54._28_4_ = fVar209;
            auVar55._4_4_ = fVar162 * fVar141;
            auVar55._0_4_ = fVar157 * fVar142;
            auVar55._8_4_ = fVar157 * fVar120;
            auVar55._12_4_ = fVar162 * fVar121;
            auVar55._16_4_ = fVar157 * fVar122;
            auVar55._20_4_ = fVar162 * fVar123;
            auVar55._24_4_ = fVar157 * fVar124;
            auVar55._28_4_ = fVar162;
            auVar56._4_4_ = (float)local_700._4_4_ * fVar141;
            auVar56._0_4_ = (float)local_700._0_4_ * fVar142;
            auVar56._8_4_ = fStack_6f8 * fVar120;
            auVar56._12_4_ = fStack_6f4 * fVar121;
            auVar56._16_4_ = fStack_6f0 * fVar122;
            auVar56._20_4_ = fStack_6ec * fVar123;
            auVar56._24_4_ = fStack_6e8 * fVar124;
            auVar56._28_4_ = pfVar4[7];
            auVar118 = *(undefined1 (*) [32])(lVar21 + 0x21b2a60 + lVar101 * 4);
            auVar130 = vfmadd231ps_fma(auVar54,auVar118,auVar149);
            auVar158 = vfmadd231ps_fma(auVar55,auVar118,auVar206);
            auVar164 = vfmadd231ps_fma(auVar56,local_580,auVar118);
            auVar118 = *(undefined1 (*) [32])(lVar21 + 0x21b25dc + lVar101 * 4);
            auVar130 = vfmadd231ps_fma(ZEXT1632(auVar130),auVar118,auVar202);
            auVar158 = vfmadd231ps_fma(ZEXT1632(auVar158),auVar118,auVar220);
            auVar164 = vfmadd231ps_fma(ZEXT1632(auVar164),local_100,auVar118);
            auVar118 = *(undefined1 (*) [32])(lVar21 + 0x21b2158 + lVar101 * 4);
            auVar130 = vfmadd231ps_fma(ZEXT1632(auVar130),auVar118,auVar217);
            auVar158 = vfmadd231ps_fma(ZEXT1632(auVar158),auVar118,local_5a0);
            auVar164 = vfmadd231ps_fma(ZEXT1632(auVar164),local_6a0,auVar118);
            auVar199._8_4_ = 0x7fffffff;
            auVar199._0_8_ = 0x7fffffff7fffffff;
            auVar199._12_4_ = 0x7fffffff;
            auVar199._16_4_ = 0x7fffffff;
            auVar199._20_4_ = 0x7fffffff;
            auVar199._24_4_ = 0x7fffffff;
            auVar199._28_4_ = 0x7fffffff;
            auVar118 = vandps_avx(ZEXT1632(auVar143),auVar199);
            auVar180 = vandps_avx(ZEXT1632(auVar129),auVar199);
            auVar180 = vmaxps_avx(auVar118,auVar180);
            auVar118 = vandps_avx(ZEXT1632(auVar105),auVar199);
            auVar118 = vmaxps_avx(auVar180,auVar118);
            auVar118 = vcmpps_avx(auVar118,_local_4c0,1);
            auVar154 = vblendvps_avx(ZEXT1632(auVar143),auVar112,auVar118);
            auVar7 = vblendvps_avx(ZEXT1632(auVar129),local_420,auVar118);
            auVar118 = vandps_avx(ZEXT1632(auVar130),auVar199);
            auVar180 = vandps_avx(ZEXT1632(auVar158),auVar199);
            auVar180 = vmaxps_avx(auVar118,auVar180);
            auVar118 = vandps_avx(auVar199,ZEXT1632(auVar164));
            auVar118 = vmaxps_avx(auVar180,auVar118);
            auVar180 = vcmpps_avx(auVar118,_local_4c0,1);
            auVar118 = vblendvps_avx(ZEXT1632(auVar130),auVar112,auVar180);
            auVar180 = vblendvps_avx(ZEXT1632(auVar158),local_420,auVar180);
            auVar106 = vfmadd213ps_fma(auVar137,local_6a0,ZEXT1632(auVar106));
            auVar143 = vfmadd213ps_fma(auVar154,auVar154,ZEXT832(0) << 0x20);
            auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),auVar7,auVar7);
            auVar137 = vrsqrtps_avx(ZEXT1632(auVar143));
            fVar142 = auVar137._0_4_;
            fVar141 = auVar137._4_4_;
            fVar120 = auVar137._8_4_;
            fVar121 = auVar137._12_4_;
            fVar122 = auVar137._16_4_;
            fVar123 = auVar137._20_4_;
            fVar124 = auVar137._24_4_;
            auVar57._4_4_ = fVar141 * fVar141 * fVar141 * auVar143._4_4_ * -0.5;
            auVar57._0_4_ = fVar142 * fVar142 * fVar142 * auVar143._0_4_ * -0.5;
            auVar57._8_4_ = fVar120 * fVar120 * fVar120 * auVar143._8_4_ * -0.5;
            auVar57._12_4_ = fVar121 * fVar121 * fVar121 * auVar143._12_4_ * -0.5;
            auVar57._16_4_ = fVar122 * fVar122 * fVar122 * -0.0;
            auVar57._20_4_ = fVar123 * fVar123 * fVar123 * -0.0;
            auVar57._24_4_ = fVar124 * fVar124 * fVar124 * -0.0;
            auVar57._28_4_ = 0;
            auVar219._8_4_ = 0x3fc00000;
            auVar219._0_8_ = 0x3fc000003fc00000;
            auVar219._12_4_ = 0x3fc00000;
            auVar219._16_4_ = 0x3fc00000;
            auVar219._20_4_ = 0x3fc00000;
            auVar219._24_4_ = 0x3fc00000;
            auVar219._28_4_ = 0x3fc00000;
            auVar143 = vfmadd231ps_fma(auVar57,auVar219,auVar137);
            fVar142 = auVar143._0_4_;
            fVar141 = auVar143._4_4_;
            auVar58._4_4_ = auVar7._4_4_ * fVar141;
            auVar58._0_4_ = auVar7._0_4_ * fVar142;
            fVar120 = auVar143._8_4_;
            auVar58._8_4_ = auVar7._8_4_ * fVar120;
            fVar121 = auVar143._12_4_;
            auVar58._12_4_ = auVar7._12_4_ * fVar121;
            auVar58._16_4_ = auVar7._16_4_ * 0.0;
            auVar58._20_4_ = auVar7._20_4_ * 0.0;
            auVar58._24_4_ = auVar7._24_4_ * 0.0;
            auVar58._28_4_ = auVar137._28_4_;
            auVar59._4_4_ = fVar141 * -auVar154._4_4_;
            auVar59._0_4_ = fVar142 * -auVar154._0_4_;
            auVar59._8_4_ = fVar120 * -auVar154._8_4_;
            auVar59._12_4_ = fVar121 * -auVar154._12_4_;
            auVar59._16_4_ = -auVar154._16_4_ * 0.0;
            auVar59._20_4_ = -auVar154._20_4_ * 0.0;
            auVar59._24_4_ = -auVar154._24_4_ * 0.0;
            auVar59._28_4_ = auVar7._28_4_;
            auVar143 = vfmadd213ps_fma(auVar118,auVar118,ZEXT832(0) << 0x20);
            auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),auVar180,auVar180);
            auVar137 = vrsqrtps_avx(ZEXT1632(auVar143));
            auVar60._28_4_ = auVar112._28_4_;
            auVar60._0_28_ =
                 ZEXT1628(CONCAT412(fVar121 * 0.0,
                                    CONCAT48(fVar120 * 0.0,CONCAT44(fVar141 * 0.0,fVar142 * 0.0))));
            fVar142 = auVar137._0_4_;
            fVar141 = auVar137._4_4_;
            fVar120 = auVar137._8_4_;
            fVar121 = auVar137._12_4_;
            fVar122 = auVar137._16_4_;
            fVar123 = auVar137._20_4_;
            fVar124 = auVar137._24_4_;
            auVar61._4_4_ = fVar141 * fVar141 * fVar141 * auVar143._4_4_ * -0.5;
            auVar61._0_4_ = fVar142 * fVar142 * fVar142 * auVar143._0_4_ * -0.5;
            auVar61._8_4_ = fVar120 * fVar120 * fVar120 * auVar143._8_4_ * -0.5;
            auVar61._12_4_ = fVar121 * fVar121 * fVar121 * auVar143._12_4_ * -0.5;
            auVar61._16_4_ = fVar122 * fVar122 * fVar122 * -0.0;
            auVar61._20_4_ = fVar123 * fVar123 * fVar123 * -0.0;
            auVar61._24_4_ = fVar124 * fVar124 * fVar124 * -0.0;
            auVar61._28_4_ = 0;
            auVar143 = vfmadd231ps_fma(auVar61,auVar219,auVar137);
            fVar142 = auVar143._0_4_;
            fVar141 = auVar143._4_4_;
            auVar62._4_4_ = auVar180._4_4_ * fVar141;
            auVar62._0_4_ = auVar180._0_4_ * fVar142;
            fVar120 = auVar143._8_4_;
            auVar62._8_4_ = auVar180._8_4_ * fVar120;
            fVar121 = auVar143._12_4_;
            auVar62._12_4_ = auVar180._12_4_ * fVar121;
            auVar62._16_4_ = auVar180._16_4_ * 0.0;
            auVar62._20_4_ = auVar180._20_4_ * 0.0;
            auVar62._24_4_ = auVar180._24_4_ * 0.0;
            auVar62._28_4_ = 0;
            auVar63._4_4_ = fVar141 * -auVar118._4_4_;
            auVar63._0_4_ = fVar142 * -auVar118._0_4_;
            auVar63._8_4_ = fVar120 * -auVar118._8_4_;
            auVar63._12_4_ = fVar121 * -auVar118._12_4_;
            auVar63._16_4_ = -auVar118._16_4_ * 0.0;
            auVar63._20_4_ = -auVar118._20_4_ * 0.0;
            auVar63._24_4_ = -auVar118._24_4_ * 0.0;
            auVar63._28_4_ = auVar137._28_4_;
            auVar64._28_4_ = 0xbf000000;
            auVar64._0_28_ =
                 ZEXT1628(CONCAT412(fVar121 * 0.0,
                                    CONCAT48(fVar120 * 0.0,CONCAT44(fVar141 * 0.0,fVar142 * 0.0))));
            auVar143 = vfmadd213ps_fma(auVar58,ZEXT1632(auVar169),local_400);
            auVar137 = ZEXT1632(auVar169);
            auVar129 = vfmadd213ps_fma(auVar59,auVar137,local_660);
            auVar105 = vfmadd213ps_fma(auVar60,auVar137,ZEXT1632(auVar106));
            auVar104 = vfnmadd213ps_fma(auVar58,auVar137,local_400);
            auVar130 = vfmadd213ps_fma(auVar62,ZEXT1632(auVar16),local_440);
            auVar128 = vfnmadd213ps_fma(auVar59,auVar137,local_660);
            auVar137 = ZEXT1632(auVar16);
            auVar158 = vfmadd213ps_fma(auVar63,auVar137,local_640);
            auVar159 = ZEXT1632(auVar169);
            auVar175 = vfnmadd231ps_fma(ZEXT1632(auVar106),auVar159,auVar60);
            auVar106 = vfmadd213ps_fma(auVar64,auVar137,ZEXT1632(auVar107));
            auVar163 = vfnmadd213ps_fma(auVar62,auVar137,local_440);
            auVar174 = vfnmadd213ps_fma(auVar63,auVar137,local_640);
            auVar176 = vfnmadd231ps_fma(ZEXT1632(auVar107),ZEXT1632(auVar16),auVar64);
            auVar137 = vsubps_avx(ZEXT1632(auVar158),ZEXT1632(auVar128));
            auVar118 = vsubps_avx(ZEXT1632(auVar106),ZEXT1632(auVar175));
            auVar183._0_4_ = auVar137._0_4_ * auVar175._0_4_;
            auVar183._4_4_ = auVar137._4_4_ * auVar175._4_4_;
            auVar183._8_4_ = auVar137._8_4_ * auVar175._8_4_;
            auVar183._12_4_ = auVar137._12_4_ * auVar175._12_4_;
            auVar183._16_4_ = auVar137._16_4_ * 0.0;
            auVar183._20_4_ = auVar137._20_4_ * 0.0;
            auVar183._24_4_ = auVar137._24_4_ * 0.0;
            auVar183._28_4_ = 0;
            auVar164 = vfmsub231ps_fma(auVar183,ZEXT1632(auVar128),auVar118);
            auVar65._4_4_ = auVar104._4_4_ * auVar118._4_4_;
            auVar65._0_4_ = auVar104._0_4_ * auVar118._0_4_;
            auVar65._8_4_ = auVar104._8_4_ * auVar118._8_4_;
            auVar65._12_4_ = auVar104._12_4_ * auVar118._12_4_;
            auVar65._16_4_ = auVar118._16_4_ * 0.0;
            auVar65._20_4_ = auVar118._20_4_ * 0.0;
            auVar65._24_4_ = auVar118._24_4_ * 0.0;
            auVar65._28_4_ = auVar118._28_4_;
            auVar192 = ZEXT1632(auVar104);
            auVar118 = vsubps_avx(ZEXT1632(auVar130),auVar192);
            auVar119 = ZEXT1632(auVar175);
            auVar107 = vfmsub231ps_fma(auVar65,auVar119,auVar118);
            auVar66._4_4_ = auVar128._4_4_ * auVar118._4_4_;
            auVar66._0_4_ = auVar128._0_4_ * auVar118._0_4_;
            auVar66._8_4_ = auVar128._8_4_ * auVar118._8_4_;
            auVar66._12_4_ = auVar128._12_4_ * auVar118._12_4_;
            auVar66._16_4_ = auVar118._16_4_ * 0.0;
            auVar66._20_4_ = auVar118._20_4_ * 0.0;
            auVar66._24_4_ = auVar118._24_4_ * 0.0;
            auVar66._28_4_ = auVar118._28_4_;
            auVar104 = vfmsub231ps_fma(auVar66,auVar192,auVar137);
            auVar107 = vfmadd231ps_fma(ZEXT1632(auVar104),ZEXT832(0) << 0x20,ZEXT1632(auVar107));
            auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),ZEXT832(0) << 0x20,ZEXT1632(auVar164));
            auVar20 = vcmpps_avx(ZEXT1632(auVar107),ZEXT832(0) << 0x20,2);
            auVar137 = vblendvps_avx(ZEXT1632(auVar163),ZEXT1632(auVar143),auVar20);
            auVar118 = vblendvps_avx(ZEXT1632(auVar174),ZEXT1632(auVar129),auVar20);
            auVar180 = vblendvps_avx(ZEXT1632(auVar176),ZEXT1632(auVar105),auVar20);
            auVar154 = vblendvps_avx(auVar192,ZEXT1632(auVar130),auVar20);
            auVar7 = vblendvps_avx(ZEXT1632(auVar128),ZEXT1632(auVar158),auVar20);
            auVar13 = vblendvps_avx(auVar119,ZEXT1632(auVar106),auVar20);
            auVar192 = vblendvps_avx(ZEXT1632(auVar130),auVar192,auVar20);
            auVar112 = vblendvps_avx(ZEXT1632(auVar158),ZEXT1632(auVar128),auVar20);
            auVar107 = vpackssdw_avx(local_520._0_16_,local_520._16_16_);
            auVar119 = vblendvps_avx(ZEXT1632(auVar106),auVar119,auVar20);
            auVar192 = vsubps_avx(auVar192,auVar137);
            auVar112 = vsubps_avx(auVar112,auVar118);
            auVar18 = vsubps_avx(auVar119,auVar180);
            auVar19 = vsubps_avx(auVar137,auVar154);
            auVar113 = vsubps_avx(auVar118,auVar7);
            auVar131 = vsubps_avx(auVar180,auVar13);
            auVar177._0_4_ = auVar18._0_4_ * auVar137._0_4_;
            auVar177._4_4_ = auVar18._4_4_ * auVar137._4_4_;
            auVar177._8_4_ = auVar18._8_4_ * auVar137._8_4_;
            auVar177._12_4_ = auVar18._12_4_ * auVar137._12_4_;
            auVar177._16_4_ = auVar18._16_4_ * auVar137._16_4_;
            auVar177._20_4_ = auVar18._20_4_ * auVar137._20_4_;
            auVar177._24_4_ = auVar18._24_4_ * auVar137._24_4_;
            auVar177._28_4_ = 0;
            auVar106 = vfmsub231ps_fma(auVar177,auVar180,auVar192);
            auVar67._4_4_ = auVar192._4_4_ * auVar118._4_4_;
            auVar67._0_4_ = auVar192._0_4_ * auVar118._0_4_;
            auVar67._8_4_ = auVar192._8_4_ * auVar118._8_4_;
            auVar67._12_4_ = auVar192._12_4_ * auVar118._12_4_;
            auVar67._16_4_ = auVar192._16_4_ * auVar118._16_4_;
            auVar67._20_4_ = auVar192._20_4_ * auVar118._20_4_;
            auVar67._24_4_ = auVar192._24_4_ * auVar118._24_4_;
            auVar67._28_4_ = auVar119._28_4_;
            auVar143 = vfmsub231ps_fma(auVar67,auVar137,auVar112);
            auVar214 = ZEXT864(0) << 0x20;
            auVar106 = vfmadd231ps_fma(ZEXT1632(auVar143),ZEXT832(0) << 0x20,ZEXT1632(auVar106));
            auVar178._0_4_ = auVar112._0_4_ * auVar180._0_4_;
            auVar178._4_4_ = auVar112._4_4_ * auVar180._4_4_;
            auVar178._8_4_ = auVar112._8_4_ * auVar180._8_4_;
            auVar178._12_4_ = auVar112._12_4_ * auVar180._12_4_;
            auVar178._16_4_ = auVar112._16_4_ * auVar180._16_4_;
            auVar178._20_4_ = auVar112._20_4_ * auVar180._20_4_;
            auVar178._24_4_ = auVar112._24_4_ * auVar180._24_4_;
            auVar178._28_4_ = 0;
            auVar143 = vfmsub231ps_fma(auVar178,auVar118,auVar18);
            auVar143 = vfmadd231ps_fma(ZEXT1632(auVar106),ZEXT832(0) << 0x20,ZEXT1632(auVar143));
            auVar179._0_4_ = auVar131._0_4_ * auVar154._0_4_;
            auVar179._4_4_ = auVar131._4_4_ * auVar154._4_4_;
            auVar179._8_4_ = auVar131._8_4_ * auVar154._8_4_;
            auVar179._12_4_ = auVar131._12_4_ * auVar154._12_4_;
            auVar179._16_4_ = auVar131._16_4_ * auVar154._16_4_;
            auVar179._20_4_ = auVar131._20_4_ * auVar154._20_4_;
            auVar179._24_4_ = auVar131._24_4_ * auVar154._24_4_;
            auVar179._28_4_ = 0;
            auVar106 = vfmsub231ps_fma(auVar179,auVar19,auVar13);
            auVar68._4_4_ = auVar113._4_4_ * auVar13._4_4_;
            auVar68._0_4_ = auVar113._0_4_ * auVar13._0_4_;
            auVar68._8_4_ = auVar113._8_4_ * auVar13._8_4_;
            auVar68._12_4_ = auVar113._12_4_ * auVar13._12_4_;
            auVar68._16_4_ = auVar113._16_4_ * auVar13._16_4_;
            auVar68._20_4_ = auVar113._20_4_ * auVar13._20_4_;
            auVar68._24_4_ = auVar113._24_4_ * auVar13._24_4_;
            auVar68._28_4_ = auVar13._28_4_;
            auVar129 = vfmsub231ps_fma(auVar68,auVar7,auVar131);
            auVar69._4_4_ = auVar19._4_4_ * auVar7._4_4_;
            auVar69._0_4_ = auVar19._0_4_ * auVar7._0_4_;
            auVar69._8_4_ = auVar19._8_4_ * auVar7._8_4_;
            auVar69._12_4_ = auVar19._12_4_ * auVar7._12_4_;
            auVar69._16_4_ = auVar19._16_4_ * auVar7._16_4_;
            auVar69._20_4_ = auVar19._20_4_ * auVar7._20_4_;
            auVar69._24_4_ = auVar19._24_4_ * auVar7._24_4_;
            auVar69._28_4_ = auVar7._28_4_;
            auVar105 = vfmsub231ps_fma(auVar69,auVar113,auVar154);
            auVar106 = vfmadd231ps_fma(ZEXT1632(auVar105),ZEXT832(0) << 0x20,ZEXT1632(auVar106));
            auVar129 = vfmadd231ps_fma(ZEXT1632(auVar106),ZEXT832(0) << 0x20,ZEXT1632(auVar129));
            auVar154 = vmaxps_avx(ZEXT1632(auVar143),ZEXT1632(auVar129));
            auVar154 = vcmpps_avx(auVar154,ZEXT832(0) << 0x20,2);
            auVar106 = vpackssdw_avx(auVar154._0_16_,auVar154._16_16_);
            auVar106 = vpand_avx(auVar106,auVar107);
            auVar154 = vpmovsxwd_avx2(auVar106);
            if ((((((((auVar154 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar154 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar154 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar154 >> 0x7f,0) == '\0') &&
                  (auVar154 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar154 >> 0xbf,0) == '\0') &&
                (auVar154 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar154[0x1f]) {
              auVar185 = ZEXT3264(CONCAT824(uStack_5c8,
                                            CONCAT816(uStack_5d0,CONCAT88(uStack_5d8,local_5e0))));
              auVar200 = ZEXT3264(auVar196);
            }
            else {
              auVar70._4_4_ = auVar112._4_4_ * auVar131._4_4_;
              auVar70._0_4_ = auVar112._0_4_ * auVar131._0_4_;
              auVar70._8_4_ = auVar112._8_4_ * auVar131._8_4_;
              auVar70._12_4_ = auVar112._12_4_ * auVar131._12_4_;
              auVar70._16_4_ = auVar112._16_4_ * auVar131._16_4_;
              auVar70._20_4_ = auVar112._20_4_ * auVar131._20_4_;
              auVar70._24_4_ = auVar112._24_4_ * auVar131._24_4_;
              auVar70._28_4_ = auVar154._28_4_;
              auVar164 = vfmsub231ps_fma(auVar70,auVar113,auVar18);
              auVar184._0_4_ = auVar19._0_4_ * auVar18._0_4_;
              auVar184._4_4_ = auVar19._4_4_ * auVar18._4_4_;
              auVar184._8_4_ = auVar19._8_4_ * auVar18._8_4_;
              auVar184._12_4_ = auVar19._12_4_ * auVar18._12_4_;
              auVar184._16_4_ = auVar19._16_4_ * auVar18._16_4_;
              auVar184._20_4_ = auVar19._20_4_ * auVar18._20_4_;
              auVar184._24_4_ = auVar19._24_4_ * auVar18._24_4_;
              auVar184._28_4_ = 0;
              auVar158 = vfmsub231ps_fma(auVar184,auVar192,auVar131);
              auVar71._4_4_ = auVar192._4_4_ * auVar113._4_4_;
              auVar71._0_4_ = auVar192._0_4_ * auVar113._0_4_;
              auVar71._8_4_ = auVar192._8_4_ * auVar113._8_4_;
              auVar71._12_4_ = auVar192._12_4_ * auVar113._12_4_;
              auVar71._16_4_ = auVar192._16_4_ * auVar113._16_4_;
              auVar71._20_4_ = auVar192._20_4_ * auVar113._20_4_;
              auVar71._24_4_ = auVar192._24_4_ * auVar113._24_4_;
              auVar71._28_4_ = auVar113._28_4_;
              auVar104 = vfmsub231ps_fma(auVar71,auVar19,auVar112);
              auVar105 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar158),ZEXT1632(auVar104));
              auVar130 = vfmadd231ps_fma(ZEXT1632(auVar105),ZEXT1632(auVar164),ZEXT832(0) << 0x20);
              auVar154 = vrcpps_avx(ZEXT1632(auVar130));
              auVar212._8_4_ = 0x3f800000;
              auVar212._0_8_ = 0x3f8000003f800000;
              auVar212._12_4_ = 0x3f800000;
              auVar212._16_4_ = 0x3f800000;
              auVar212._20_4_ = 0x3f800000;
              auVar212._24_4_ = 0x3f800000;
              auVar212._28_4_ = 0x3f800000;
              auVar214 = ZEXT3264(auVar212);
              auVar105 = vfnmadd213ps_fma(auVar154,ZEXT1632(auVar130),auVar212);
              auVar105 = vfmadd132ps_fma(ZEXT1632(auVar105),auVar154,auVar154);
              auVar72._4_4_ = auVar104._4_4_ * auVar180._4_4_;
              auVar72._0_4_ = auVar104._0_4_ * auVar180._0_4_;
              auVar72._8_4_ = auVar104._8_4_ * auVar180._8_4_;
              auVar72._12_4_ = auVar104._12_4_ * auVar180._12_4_;
              auVar72._16_4_ = auVar180._16_4_ * 0.0;
              auVar72._20_4_ = auVar180._20_4_ * 0.0;
              auVar72._24_4_ = auVar180._24_4_ * 0.0;
              auVar72._28_4_ = auVar180._28_4_;
              auVar158 = vfmadd231ps_fma(auVar72,ZEXT1632(auVar158),auVar118);
              auVar158 = vfmadd231ps_fma(ZEXT1632(auVar158),ZEXT1632(auVar164),auVar137);
              fVar142 = auVar105._0_4_;
              fVar141 = auVar105._4_4_;
              fVar120 = auVar105._8_4_;
              fVar121 = auVar105._12_4_;
              auVar180 = ZEXT1632(CONCAT412(fVar121 * auVar158._12_4_,
                                            CONCAT48(fVar120 * auVar158._8_4_,
                                                     CONCAT44(fVar141 * auVar158._4_4_,
                                                              fVar142 * auVar158._0_4_))));
              uVar102 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar161._4_4_ = uVar102;
              auVar161._0_4_ = uVar102;
              auVar161._8_4_ = uVar102;
              auVar161._12_4_ = uVar102;
              auVar161._16_4_ = uVar102;
              auVar161._20_4_ = uVar102;
              auVar161._24_4_ = uVar102;
              auVar161._28_4_ = uVar102;
              auVar89._4_4_ = uStack_5bc;
              auVar89._0_4_ = local_5c0;
              auVar89._8_4_ = uStack_5b8;
              auVar89._12_4_ = uStack_5b4;
              auVar89._16_4_ = uStack_5b0;
              auVar89._20_4_ = uStack_5ac;
              auVar89._24_4_ = uStack_5a8;
              auVar89._28_4_ = uStack_5a4;
              auVar137 = vcmpps_avx(auVar89,auVar180,2);
              auVar118 = vcmpps_avx(auVar180,auVar161,2);
              auVar137 = vandps_avx(auVar118,auVar137);
              auVar105 = vpackssdw_avx(auVar137._0_16_,auVar137._16_16_);
              auVar106 = vpand_avx(auVar106,auVar105);
              auVar137 = vpmovsxwd_avx2(auVar106);
              if ((((((((auVar137 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar137 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar137 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar137 >> 0x7f,0) == '\0') &&
                    (auVar137 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar137 >> 0xbf,0) == '\0') &&
                  (auVar137 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar137[0x1f]) {
                auVar185 = ZEXT3264(CONCAT824(uStack_5c8,
                                              CONCAT816(uStack_5d0,CONCAT88(uStack_5d8,local_5e0))))
                ;
                auVar200 = ZEXT3264(auVar196);
              }
              else {
                auVar137 = vcmpps_avx(ZEXT1632(auVar130),ZEXT832(0) << 0x20,4);
                auVar105 = vpackssdw_avx(auVar137._0_16_,auVar137._16_16_);
                auVar106 = vpand_avx(auVar106,auVar105);
                auVar137 = vpmovsxwd_avx2(auVar106);
                auVar185 = ZEXT3264(CONCAT824(uStack_5c8,
                                              CONCAT816(uStack_5d0,CONCAT88(uStack_5d8,local_5e0))))
                ;
                auVar200 = ZEXT3264(auVar196);
                if ((((((((auVar137 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar137 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar137 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar137 >> 0x7f,0) != '\0') ||
                      (auVar137 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar137 >> 0xbf,0) != '\0') ||
                    (auVar137 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar137[0x1f] < '\0') {
                  auVar154 = ZEXT1632(CONCAT412(fVar121 * auVar143._12_4_,
                                                CONCAT48(fVar120 * auVar143._8_4_,
                                                         CONCAT44(fVar141 * auVar143._4_4_,
                                                                  fVar142 * auVar143._0_4_))));
                  auVar73._28_4_ = SUB84(uStack_5c8,4);
                  auVar73._0_28_ =
                       ZEXT1628(CONCAT412(fVar121 * auVar129._12_4_,
                                          CONCAT48(fVar120 * auVar129._8_4_,
                                                   CONCAT44(fVar141 * auVar129._4_4_,
                                                            fVar142 * auVar129._0_4_))));
                  auVar193._8_4_ = 0x3f800000;
                  auVar193._0_8_ = 0x3f8000003f800000;
                  auVar193._12_4_ = 0x3f800000;
                  auVar193._16_4_ = 0x3f800000;
                  auVar193._20_4_ = 0x3f800000;
                  auVar193._24_4_ = 0x3f800000;
                  auVar193._28_4_ = 0x3f800000;
                  auVar118 = vsubps_avx(auVar193,auVar154);
                  local_680 = vblendvps_avx(auVar118,auVar154,auVar20);
                  auVar118 = vsubps_avx(auVar193,auVar73);
                  local_500 = vblendvps_avx(auVar118,auVar73,auVar20);
                  auVar185 = ZEXT3264(auVar137);
                  auVar200 = ZEXT3264(auVar180);
                }
              }
            }
            auVar208 = ZEXT3264(auVar111);
            uVar96 = uVar96 & 0xffffffff;
            auVar137 = auVar185._0_32_;
            if ((((((((auVar137 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar137 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar137 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar137 >> 0x7f,0) == '\0') &&
                  (auVar185 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                 SUB321(auVar137 >> 0xbf,0) == '\0') &&
                (auVar185 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                -1 < auVar185[0x1f]) {
              auVar139 = ZEXT3264(local_680);
              auVar189 = ZEXT3264(CONCAT428(fVar209,CONCAT424(fVar209,CONCAT420(fVar209,CONCAT416(
                                                  fVar209,CONCAT412(fVar209,CONCAT48(fVar209,
                                                  CONCAT44(fVar209,fVar209))))))));
              auVar185 = ZEXT3264(CONCAT428(fVar162,CONCAT424(fVar157,CONCAT420(fVar162,CONCAT416(
                                                  fVar157,CONCAT412(fVar162,CONCAT48(fVar157,uVar103
                                                                                    )))))));
            }
            else {
              auVar118 = vsubps_avx(ZEXT1632(auVar16),auVar159);
              auVar16 = vfmadd213ps_fma(auVar118,local_680,auVar159);
              fVar142 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
              auVar74._4_4_ = (auVar16._4_4_ + auVar16._4_4_) * fVar142;
              auVar74._0_4_ = (auVar16._0_4_ + auVar16._0_4_) * fVar142;
              auVar74._8_4_ = (auVar16._8_4_ + auVar16._8_4_) * fVar142;
              auVar74._12_4_ = (auVar16._12_4_ + auVar16._12_4_) * fVar142;
              auVar74._16_4_ = fVar142 * 0.0;
              auVar74._20_4_ = fVar142 * 0.0;
              auVar74._24_4_ = fVar142 * 0.0;
              auVar74._28_4_ = fVar142;
              local_6e0 = auVar200._0_32_;
              auVar118 = vcmpps_avx(local_6e0,auVar74,6);
              auVar180 = auVar137 & auVar118;
              auVar189 = ZEXT3264(CONCAT428(fVar209,CONCAT424(fVar209,CONCAT420(fVar209,CONCAT416(
                                                  fVar209,CONCAT412(fVar209,CONCAT48(fVar209,
                                                  CONCAT44(fVar209,fVar209))))))));
              auVar185 = ZEXT3264(CONCAT428(fVar162,CONCAT424(fVar157,CONCAT420(fVar162,CONCAT416(
                                                  fVar157,CONCAT412(fVar162,CONCAT48(fVar157,uVar103
                                                                                    )))))));
              if ((((((((auVar180 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar180 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar180 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar180 >> 0x7f,0) == '\0') &&
                    (auVar180 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar180 >> 0xbf,0) == '\0') &&
                  (auVar180 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar180[0x1f]) {
                auVar139 = ZEXT3264(local_680);
              }
              else {
                auVar138._8_4_ = 0xbf800000;
                auVar138._0_8_ = 0xbf800000bf800000;
                auVar138._12_4_ = 0xbf800000;
                auVar138._16_4_ = 0xbf800000;
                auVar138._20_4_ = 0xbf800000;
                auVar138._24_4_ = 0xbf800000;
                auVar138._28_4_ = 0xbf800000;
                auVar155._8_4_ = 0x40000000;
                auVar155._0_8_ = 0x4000000040000000;
                auVar155._12_4_ = 0x40000000;
                auVar155._16_4_ = 0x40000000;
                auVar155._20_4_ = 0x40000000;
                auVar155._24_4_ = 0x40000000;
                auVar155._28_4_ = 0x40000000;
                auVar16 = vfmadd213ps_fma(local_500,auVar155,auVar138);
                local_3a0 = local_680;
                local_380 = ZEXT1632(auVar16);
                local_320 = local_740;
                uStack_318 = uStack_738;
                local_310 = local_750;
                uStack_308 = uStack_748;
                pGVar9 = (context->scene->geometries).items[uVar98].ptr;
                auVar139 = ZEXT3264(local_680);
                local_500 = local_380;
                if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                  bVar93 = 0;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar93 = 1, pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  auVar137 = vandps_avx(auVar118,auVar137);
                  fVar142 = (float)local_340;
                  local_2c0[0] = (fVar142 + local_680._0_4_ + 0.0) * local_140;
                  local_2c0[1] = (fVar142 + local_680._4_4_ + 1.0) * fStack_13c;
                  local_2c0[2] = (fVar142 + local_680._8_4_ + 2.0) * fStack_138;
                  local_2c0[3] = (fVar142 + local_680._12_4_ + 3.0) * fStack_134;
                  fStack_2b0 = (fVar142 + local_680._16_4_ + 4.0) * fStack_130;
                  fStack_2ac = (fVar142 + local_680._20_4_ + 5.0) * fStack_12c;
                  fStack_2a8 = (fVar142 + local_680._24_4_ + 6.0) * fStack_128;
                  fStack_2a4 = fVar142 + local_680._28_4_ + 7.0;
                  local_500._0_8_ = auVar16._0_8_;
                  local_500._8_8_ = auVar16._8_8_;
                  local_2a0 = local_500._0_8_;
                  uStack_298 = local_500._8_8_;
                  uStack_290 = 0;
                  uStack_288 = 0;
                  local_280 = local_6e0;
                  uVar95 = vmovmskps_avx(auVar137);
                  if (uVar95 == 0) {
                    bVar93 = 0;
LAB_015ccec5:
                    auVar139 = ZEXT3264(local_680);
                    auVar200 = ZEXT3264(local_6e0);
                    auVar189 = ZEXT3264(CONCAT428(fVar209,CONCAT424(fVar209,CONCAT420(fVar209,
                                                  CONCAT416(fVar209,CONCAT412(fVar209,CONCAT48(
                                                  fVar209,CONCAT44(fVar209,fVar209))))))));
                    auVar185 = ZEXT3264(CONCAT428(fVar162,CONCAT424(fVar157,CONCAT420(fVar162,
                                                  CONCAT416(fVar157,CONCAT412(fVar162,CONCAT48(
                                                  fVar157,uVar103)))))));
                  }
                  else {
                    uVar96 = (ulong)(uVar95 & 0xff);
                    _local_820 = ZEXT1632(CONCAT88(auVar169._8_8_,uVar96));
                    lVar22 = 0;
                    for (; (uVar96 & 1) == 0; uVar96 = uVar96 >> 1 | 0x8000000000000000) {
                      lVar22 = lVar22 + 1;
                    }
                    local_920 = ZEXT1632(CONCAT88(auVar107._8_8_,lVar22));
                    local_660 = ZEXT1632(CONCAT124(auVar166._4_12_,
                                                   *(undefined4 *)(ray + k * 4 + 0x100)));
                    _local_480 = *pauVar3;
                    _local_460 = *pauVar2;
                    local_360 = local_6e0;
                    local_33c = iVar94;
                    local_330 = uVar87;
                    uStack_328 = uVar88;
                    do {
                      fVar142 = local_2c0[local_920._0_8_];
                      auVar110._4_4_ = fVar142;
                      auVar110._0_4_ = fVar142;
                      auVar110._8_4_ = fVar142;
                      auVar110._12_4_ = fVar142;
                      local_200._16_4_ = fVar142;
                      local_200._0_16_ = auVar110;
                      local_200._20_4_ = fVar142;
                      local_200._24_4_ = fVar142;
                      local_200._28_4_ = fVar142;
                      local_1e0 = *(undefined4 *)((long)&local_2a0 + local_920._0_8_ * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) =
                           *(undefined4 *)(local_280 + local_920._0_8_ * 4);
                      fVar120 = 1.0 - fVar142;
                      auVar169 = ZEXT416((uint)(fVar142 * fVar120 * 4.0));
                      auVar166 = vfnmsub213ss_fma(auVar110,auVar110,auVar169);
                      auVar169 = vfmadd213ss_fma(ZEXT416((uint)fVar120),ZEXT416((uint)fVar120),
                                                 auVar169);
                      fVar141 = auVar169._0_4_ * 0.5;
                      fVar142 = fVar142 * fVar142 * 0.5;
                      auVar170._0_4_ = fVar142 * (float)local_5f0._0_4_;
                      auVar170._4_4_ = fVar142 * (float)local_5f0._4_4_;
                      auVar170._8_4_ = fVar142 * fStack_5e8;
                      auVar170._12_4_ = fVar142 * fStack_5e4;
                      auVar147._4_4_ = fVar141;
                      auVar147._0_4_ = fVar141;
                      auVar147._8_4_ = fVar141;
                      auVar147._12_4_ = fVar141;
                      auVar169 = vfmadd132ps_fma(auVar147,auVar170,auVar15);
                      fVar142 = auVar166._0_4_ * 0.5;
                      auVar171._4_4_ = fVar142;
                      auVar171._0_4_ = fVar142;
                      auVar171._8_4_ = fVar142;
                      auVar171._12_4_ = fVar142;
                      auVar169 = vfmadd132ps_fma(auVar171,auVar169,auVar14);
                      local_730.context = context->user;
                      fVar142 = fVar120 * -fVar120 * 0.5;
                      auVar148._4_4_ = fVar142;
                      auVar148._0_4_ = fVar142;
                      auVar148._8_4_ = fVar142;
                      auVar148._12_4_ = fVar142;
                      auVar166 = vfmadd132ps_fma(auVar148,auVar169,auVar12);
                      local_260 = auVar166._0_4_;
                      uStack_25c = local_260;
                      uStack_258 = local_260;
                      uStack_254 = local_260;
                      uStack_250 = local_260;
                      uStack_24c = local_260;
                      uStack_248 = local_260;
                      uStack_244 = local_260;
                      auVar169 = vmovshdup_avx(auVar166);
                      local_240 = auVar169._0_8_;
                      uStack_238 = local_240;
                      uStack_230 = local_240;
                      uStack_228 = local_240;
                      auVar169 = vshufps_avx(auVar166,auVar166,0xaa);
                      local_220._8_8_ = auVar169._0_8_;
                      local_220._0_8_ = local_220._8_8_;
                      local_220._16_8_ = local_220._8_8_;
                      local_220._24_8_ = local_220._8_8_;
                      uStack_1dc = local_1e0;
                      uStack_1d8 = local_1e0;
                      uStack_1d4 = local_1e0;
                      uStack_1d0 = local_1e0;
                      uStack_1cc = local_1e0;
                      uStack_1c8 = local_1e0;
                      uStack_1c4 = local_1e0;
                      local_1c0 = CONCAT44(uStack_53c,local_540);
                      uStack_1b8 = CONCAT44(uStack_534,uStack_538);
                      uStack_1b0 = CONCAT44(uStack_52c,uStack_530);
                      uStack_1a8 = CONCAT44(uStack_524,uStack_528);
                      local_1a0._4_4_ = uStack_11c;
                      local_1a0._0_4_ = local_120;
                      local_1a0._8_4_ = uStack_118;
                      local_1a0._12_4_ = uStack_114;
                      local_1a0._16_4_ = uStack_110;
                      local_1a0._20_4_ = uStack_10c;
                      local_1a0._24_4_ = uStack_108;
                      local_1a0._28_4_ = uStack_104;
                      vpcmpeqd_avx2(local_1a0,local_1a0);
                      local_180 = (local_730.context)->instID[0];
                      uStack_17c = local_180;
                      uStack_178 = local_180;
                      uStack_174 = local_180;
                      uStack_170 = local_180;
                      uStack_16c = local_180;
                      uStack_168 = local_180;
                      uStack_164 = local_180;
                      local_160 = (local_730.context)->instPrimID[0];
                      uStack_15c = local_160;
                      uStack_158 = local_160;
                      uStack_154 = local_160;
                      uStack_150 = local_160;
                      uStack_14c = local_160;
                      uStack_148 = local_160;
                      uStack_144 = local_160;
                      local_620 = local_3c0;
                      local_730.valid = (int *)local_620;
                      local_730.geometryUserPtr = pGVar9->userPtr;
                      local_730.hit = (RTCHitN *)&local_260;
                      local_730.N = 8;
                      local_730.ray = (RTCRayN *)ray;
                      if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar214 = ZEXT1664(auVar214._0_16_);
                        (*pGVar9->occlusionFilterN)(&local_730);
                      }
                      auVar118 = vpcmpeqd_avx2(local_620,_DAT_01faff00);
                      auVar137 = _DAT_01fe9960 & ~auVar118;
                      if ((((((((auVar137 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar137 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (auVar137 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(auVar137 >> 0x7f,0) == '\0') &&
                            (auVar137 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar137 >> 0xbf,0) == '\0') &&
                          (auVar137 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar137[0x1f]) {
                        auVar118 = auVar118 ^ _DAT_01fe9960;
                      }
                      else {
                        p_Var11 = context->args->filter;
                        if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar214 = ZEXT1664(auVar214._0_16_);
                          (*p_Var11)(&local_730);
                        }
                        auVar137 = vpcmpeqd_avx2(local_620,_DAT_01faff00);
                        auVar118 = auVar137 ^ _DAT_01fe9960;
                        auVar156._8_4_ = 0xff800000;
                        auVar156._0_8_ = 0xff800000ff800000;
                        auVar156._12_4_ = 0xff800000;
                        auVar156._16_4_ = 0xff800000;
                        auVar156._20_4_ = 0xff800000;
                        auVar156._24_4_ = 0xff800000;
                        auVar156._28_4_ = 0xff800000;
                        auVar137 = vblendvps_avx(auVar156,*(undefined1 (*) [32])
                                                           (local_730.ray + 0x100),auVar137);
                        *(undefined1 (*) [32])(local_730.ray + 0x100) = auVar137;
                      }
                      if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar118 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar118 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar118 >> 0x7f,0) != '\0') ||
                            (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar118 >> 0xbf,0) != '\0') ||
                          (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar118[0x1f] < '\0') {
                        bVar93 = 1;
                        goto LAB_015ccec5;
                      }
                      *(undefined4 *)(ray + k * 4 + 0x100) = local_660._0_4_;
                      uVar97 = (ulong)local_820 ^ 1L << (local_920._0_8_ & 0x3f);
                      bVar93 = 0;
                      local_820 = (undefined1  [8])uVar97;
                      lVar22 = 0;
                      for (uVar96 = uVar97; (uVar96 & 1) == 0;
                          uVar96 = uVar96 >> 1 | 0x8000000000000000) {
                        lVar22 = lVar22 + 1;
                      }
                      local_920._0_8_ = lVar22;
                      auVar139 = ZEXT3264(local_680);
                      auVar200 = ZEXT3264(local_6e0);
                      auVar189 = ZEXT3264(CONCAT428(fVar209,CONCAT424(fVar209,CONCAT420(fVar209,
                                                  CONCAT416(fVar209,CONCAT412(fVar209,CONCAT48(
                                                  fVar209,CONCAT44(fVar209,fVar209))))))));
                      auVar185 = ZEXT3264(CONCAT428(fVar162,CONCAT424(fVar157,CONCAT420(fVar162,
                                                  CONCAT416(fVar157,CONCAT412(fVar162,CONCAT48(
                                                  fVar157,uVar103)))))));
                    } while (uVar97 != 0);
                  }
                }
                auVar208 = ZEXT3264(auVar111);
                uVar96 = (ulong)CONCAT31(local_6c0._1_3_,local_6c0[0] | bVar93);
              }
            }
          }
          local_680 = auVar139._0_32_;
          uVar95 = (uint)uVar96;
          lVar101 = lVar101 + 8;
        } while ((int)lVar101 < iVar94);
      }
      bVar93 = (byte)uVar95;
      if ((uVar95 & 1) != 0) break;
      uVar102 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar108._4_4_ = uVar102;
      auVar108._0_4_ = uVar102;
      auVar108._8_4_ = uVar102;
      auVar108._12_4_ = uVar102;
      auVar169 = vcmpps_avx(local_3e0,auVar108,2);
      uVar98 = vmovmskps_avx(auVar169);
      uVar98 = (uint)uVar99 & uVar98;
    } while (uVar98 != 0);
  }
  return (bool)(bVar93 & 1);
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }